

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<8,4>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  bool bVar53;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  uint uVar61;
  uint uVar62;
  uint uVar63;
  int iVar64;
  ulong uVar65;
  long lVar67;
  byte bVar68;
  uint uVar69;
  ulong uVar70;
  bool bVar71;
  ulong uVar72;
  bool bVar73;
  float t1;
  float fVar84;
  undefined1 auVar76 [16];
  float fVar74;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined4 uVar75;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar85;
  float fVar100;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar143;
  float fVar144;
  float fVar157;
  float fVar158;
  vfloat4 b0;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar159;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar160;
  float fVar161;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar162;
  undefined8 uVar163;
  float fVar185;
  vfloat4 b0_1;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar182;
  float fVar187;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar184;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar183;
  float fVar186;
  float fVar188;
  undefined1 auVar181 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  vfloat4 a0_2;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  vfloat4 a0_3;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar241;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar240;
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 in_ZMM10 [64];
  undefined1 auVar239 [64];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  float fVar253;
  vfloat4 a0_1;
  undefined1 auVar254 [16];
  float fVar266;
  undefined1 auVar255 [16];
  undefined1 auVar261 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar262 [32];
  float fVar264;
  float fVar265;
  undefined1 in_ZMM12 [64];
  undefined1 auVar263 [64];
  vfloat4 a0;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_669;
  undefined1 local_668 [16];
  undefined1 local_608 [8];
  undefined8 uStack_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_5c8;
  float fStack_5c4;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 *local_530;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  uint auStack_418 [4];
  RTCFilterFunctionNArguments local_408;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  uint local_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint local_388;
  uint uStack_384;
  uint uStack_380;
  uint uStack_37c;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [32];
  uint uStack_288;
  float afStack_284 [7];
  RTCHitN local_268 [16];
  undefined1 local_258 [16];
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208 [16];
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  undefined1 local_1d8 [32];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar66;
  undefined1 auVar127 [32];
  
  PVar7 = prim[1];
  uVar72 = (ulong)(byte)PVar7;
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar74 = *(float *)(prim + uVar72 * 0x19 + 0x12);
  auVar12 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + uVar72 * 0x19 + 6));
  auVar76._0_4_ = fVar74 * auVar12._0_4_;
  auVar76._4_4_ = fVar74 * auVar12._4_4_;
  auVar76._8_4_ = fVar74 * auVar12._8_4_;
  auVar76._12_4_ = fVar74 * auVar12._12_4_;
  auVar210._0_4_ = fVar74 * auVar81._0_4_;
  auVar210._4_4_ = fVar74 * auVar81._4_4_;
  auVar210._8_4_ = fVar74 * auVar81._8_4_;
  auVar210._12_4_ = fVar74 * auVar81._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar72 * 4 + 6);
  auVar82 = vpmovsxbd_avx2(auVar12);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar72 * 5 + 6);
  auVar13 = vpmovsxbd_avx2(auVar81);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar282._8_8_ = 0;
  auVar282._0_8_ = *(ulong *)(prim + uVar72 * 6 + 6);
  auVar14 = vpmovsxbd_avx2(auVar282);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar72 * 0xb + 6);
  auVar15 = vpmovsxbd_avx2(auVar3);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar16 = vpmovsxbd_avx2(auVar4);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar72 + 6);
  auVar17 = vpmovsxbd_avx2(auVar5);
  auVar17 = vcvtdq2ps_avx(auVar17);
  uVar65 = (ulong)(uint)((int)(uVar72 * 9) * 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar65 + 6);
  auVar18 = vpmovsxbd_avx2(auVar6);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar233._8_8_ = 0;
  auVar233._0_8_ = *(ulong *)(prim + uVar65 + uVar72 + 6);
  auVar19 = vpmovsxbd_avx2(auVar233);
  auVar19 = vcvtdq2ps_avx(auVar19);
  uVar65 = (ulong)(uint)((int)(uVar72 * 5) << 2);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar65 + 6);
  auVar97 = vpmovsxbd_avx2(auVar106);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar275._4_4_ = auVar210._0_4_;
  auVar275._0_4_ = auVar210._0_4_;
  auVar275._8_4_ = auVar210._0_4_;
  auVar275._12_4_ = auVar210._0_4_;
  auVar275._16_4_ = auVar210._0_4_;
  auVar275._20_4_ = auVar210._0_4_;
  auVar275._24_4_ = auVar210._0_4_;
  auVar275._28_4_ = auVar210._0_4_;
  auVar12 = vmovshdup_avx(auVar210);
  uVar163 = auVar12._0_8_;
  auVar292._8_8_ = uVar163;
  auVar292._0_8_ = uVar163;
  auVar292._16_8_ = uVar163;
  auVar292._24_8_ = uVar163;
  auVar12 = vshufps_avx(auVar210,auVar210,0xaa);
  fVar74 = auVar12._0_4_;
  auVar263._0_4_ = fVar74 * auVar14._0_4_;
  fVar84 = auVar12._4_4_;
  auVar263._4_4_ = fVar84 * auVar14._4_4_;
  auVar263._8_4_ = fVar74 * auVar14._8_4_;
  auVar263._12_4_ = fVar84 * auVar14._12_4_;
  auVar263._16_4_ = fVar74 * auVar14._16_4_;
  auVar263._20_4_ = fVar84 * auVar14._20_4_;
  auVar263._28_36_ = in_ZMM12._28_36_;
  auVar263._24_4_ = fVar74 * auVar14._24_4_;
  auVar239._0_4_ = auVar17._0_4_ * fVar74;
  auVar239._4_4_ = auVar17._4_4_ * fVar84;
  auVar239._8_4_ = auVar17._8_4_ * fVar74;
  auVar239._12_4_ = auVar17._12_4_ * fVar84;
  auVar239._16_4_ = auVar17._16_4_ * fVar74;
  auVar239._20_4_ = auVar17._20_4_ * fVar84;
  auVar239._28_36_ = in_ZMM10._28_36_;
  auVar239._24_4_ = auVar17._24_4_ * fVar74;
  auVar220._0_4_ = auVar97._0_4_ * fVar74;
  auVar220._4_4_ = auVar97._4_4_ * fVar84;
  auVar220._8_4_ = auVar97._8_4_ * fVar74;
  auVar220._12_4_ = auVar97._12_4_ * fVar84;
  auVar220._16_4_ = auVar97._16_4_ * fVar74;
  auVar220._20_4_ = auVar97._20_4_ * fVar84;
  auVar220._24_4_ = auVar97._24_4_ * fVar74;
  auVar220._28_4_ = 0;
  auVar12 = vfmadd231ps_fma(auVar263._0_32_,auVar292,auVar13);
  auVar81 = vfmadd231ps_fma(auVar239._0_32_,auVar292,auVar16);
  auVar282 = vfmadd231ps_fma(auVar220,auVar19,auVar292);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar275,auVar82);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar275,auVar15);
  auVar282 = vfmadd231ps_fma(ZEXT1632(auVar282),auVar18,auVar275);
  auVar276._4_4_ = auVar76._0_4_;
  auVar276._0_4_ = auVar76._0_4_;
  auVar276._8_4_ = auVar76._0_4_;
  auVar276._12_4_ = auVar76._0_4_;
  auVar276._16_4_ = auVar76._0_4_;
  auVar276._20_4_ = auVar76._0_4_;
  auVar276._24_4_ = auVar76._0_4_;
  auVar276._28_4_ = auVar76._0_4_;
  auVar12 = vmovshdup_avx(auVar76);
  uVar163 = auVar12._0_8_;
  auVar293._8_8_ = uVar163;
  auVar293._0_8_ = uVar163;
  auVar293._16_8_ = uVar163;
  auVar293._24_8_ = uVar163;
  auVar12 = vshufps_avx(auVar76,auVar76,0xaa);
  fVar74 = auVar12._0_4_;
  auVar178._0_4_ = fVar74 * auVar14._0_4_;
  fVar84 = auVar12._4_4_;
  auVar178._4_4_ = fVar84 * auVar14._4_4_;
  auVar178._8_4_ = fVar74 * auVar14._8_4_;
  auVar178._12_4_ = fVar84 * auVar14._12_4_;
  auVar178._16_4_ = fVar74 * auVar14._16_4_;
  auVar178._20_4_ = fVar84 * auVar14._20_4_;
  auVar178._24_4_ = fVar74 * auVar14._24_4_;
  auVar178._28_4_ = 0;
  auVar22._4_4_ = auVar17._4_4_ * fVar84;
  auVar22._0_4_ = auVar17._0_4_ * fVar74;
  auVar22._8_4_ = auVar17._8_4_ * fVar74;
  auVar22._12_4_ = auVar17._12_4_ * fVar84;
  auVar22._16_4_ = auVar17._16_4_ * fVar74;
  auVar22._20_4_ = auVar17._20_4_ * fVar84;
  auVar22._24_4_ = auVar17._24_4_ * fVar74;
  auVar22._28_4_ = auVar14._28_4_;
  auVar14._4_4_ = auVar97._4_4_ * fVar84;
  auVar14._0_4_ = auVar97._0_4_ * fVar74;
  auVar14._8_4_ = auVar97._8_4_ * fVar74;
  auVar14._12_4_ = auVar97._12_4_ * fVar84;
  auVar14._16_4_ = auVar97._16_4_ * fVar74;
  auVar14._20_4_ = auVar97._20_4_ * fVar84;
  auVar14._24_4_ = auVar97._24_4_ * fVar74;
  auVar14._28_4_ = fVar84;
  auVar12 = vfmadd231ps_fma(auVar178,auVar293,auVar13);
  auVar4 = vfmadd231ps_fma(auVar22,auVar293,auVar16);
  auVar5 = vfmadd231ps_fma(auVar14,auVar293,auVar19);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar276,auVar82);
  auVar113._8_4_ = 0x7fffffff;
  auVar113._0_8_ = 0x7fffffff7fffffff;
  auVar113._12_4_ = 0x7fffffff;
  auVar113._16_4_ = 0x7fffffff;
  auVar113._20_4_ = 0x7fffffff;
  auVar113._24_4_ = 0x7fffffff;
  auVar113._28_4_ = 0x7fffffff;
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar276,auVar15);
  auVar82 = vandps_avx(ZEXT1632(auVar3),auVar113);
  auVar202._8_4_ = 0x219392ef;
  auVar202._0_8_ = 0x219392ef219392ef;
  auVar202._12_4_ = 0x219392ef;
  auVar202._16_4_ = 0x219392ef;
  auVar202._20_4_ = 0x219392ef;
  auVar202._24_4_ = 0x219392ef;
  auVar202._28_4_ = 0x219392ef;
  auVar82 = vcmpps_avx(auVar82,auVar202,1);
  auVar13 = vblendvps_avx(ZEXT1632(auVar3),auVar202,auVar82);
  auVar82 = vandps_avx(ZEXT1632(auVar81),auVar113);
  auVar82 = vcmpps_avx(auVar82,auVar202,1);
  auVar14 = vblendvps_avx(ZEXT1632(auVar81),auVar202,auVar82);
  auVar82 = vandps_avx(ZEXT1632(auVar282),auVar113);
  auVar82 = vcmpps_avx(auVar82,auVar202,1);
  auVar15 = vrcpps_avx(auVar13);
  auVar82 = vblendvps_avx(ZEXT1632(auVar282),auVar202,auVar82);
  auVar203._8_4_ = 0x3f800000;
  auVar203._0_8_ = &DAT_3f8000003f800000;
  auVar203._12_4_ = 0x3f800000;
  auVar203._16_4_ = 0x3f800000;
  auVar203._20_4_ = 0x3f800000;
  auVar203._24_4_ = 0x3f800000;
  auVar203._28_4_ = 0x3f800000;
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar276,auVar18);
  auVar16 = vrcpps_avx(auVar14);
  auVar12 = vfnmadd213ps_fma(auVar13,auVar15,auVar203);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar15,auVar15);
  auVar81 = vfnmadd213ps_fma(auVar14,auVar16,auVar203);
  auVar81 = vfmadd132ps_fma(ZEXT1632(auVar81),auVar16,auVar16);
  auVar13 = vrcpps_avx(auVar82);
  auVar282 = vfnmadd213ps_fma(auVar82,auVar13,auVar203);
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 7 + 6));
  auVar282 = vfmadd132ps_fma(ZEXT1632(auVar282),auVar13,auVar13);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar6));
  auVar15._4_4_ = auVar12._4_4_ * auVar82._4_4_;
  auVar15._0_4_ = auVar12._0_4_ * auVar82._0_4_;
  auVar15._8_4_ = auVar12._8_4_ * auVar82._8_4_;
  auVar15._12_4_ = auVar12._12_4_ * auVar82._12_4_;
  auVar15._16_4_ = auVar82._16_4_ * 0.0;
  auVar15._20_4_ = auVar82._20_4_ * 0.0;
  auVar15._24_4_ = auVar82._24_4_ * 0.0;
  auVar15._28_4_ = auVar82._28_4_;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 9 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar6));
  auVar155._0_4_ = auVar12._0_4_ * auVar82._0_4_;
  auVar155._4_4_ = auVar12._4_4_ * auVar82._4_4_;
  auVar155._8_4_ = auVar12._8_4_ * auVar82._8_4_;
  auVar155._12_4_ = auVar12._12_4_ * auVar82._12_4_;
  auVar155._16_4_ = auVar82._16_4_ * 0.0;
  auVar155._20_4_ = auVar82._20_4_ * 0.0;
  auVar155._24_4_ = auVar82._24_4_ * 0.0;
  auVar155._28_4_ = 0;
  auVar97._1_3_ = 0;
  auVar97[0] = PVar7;
  auVar13 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar7 * 0x10 + uVar72 * -2 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar4));
  auVar16._4_4_ = auVar82._4_4_ * auVar81._4_4_;
  auVar16._0_4_ = auVar82._0_4_ * auVar81._0_4_;
  auVar16._8_4_ = auVar82._8_4_ * auVar81._8_4_;
  auVar16._12_4_ = auVar82._12_4_ * auVar81._12_4_;
  auVar16._16_4_ = auVar82._16_4_ * 0.0;
  auVar16._20_4_ = auVar82._20_4_ * 0.0;
  auVar16._24_4_ = auVar82._24_4_ * 0.0;
  auVar16._28_4_ = auVar82._28_4_;
  auVar82 = vcvtdq2ps_avx(auVar13);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar4));
  auVar17._4_4_ = auVar81._4_4_ * auVar82._4_4_;
  auVar17._0_4_ = auVar81._0_4_ * auVar82._0_4_;
  auVar17._8_4_ = auVar81._8_4_ * auVar82._8_4_;
  auVar17._12_4_ = auVar81._12_4_ * auVar82._12_4_;
  auVar17._16_4_ = auVar82._16_4_ * 0.0;
  auVar17._20_4_ = auVar82._20_4_ * 0.0;
  auVar17._24_4_ = auVar82._24_4_ * 0.0;
  auVar17._28_4_ = auVar82._28_4_;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 + uVar72 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar3));
  auVar18._4_4_ = auVar82._4_4_ * auVar282._4_4_;
  auVar18._0_4_ = auVar82._0_4_ * auVar282._0_4_;
  auVar18._8_4_ = auVar82._8_4_ * auVar282._8_4_;
  auVar18._12_4_ = auVar82._12_4_ * auVar282._12_4_;
  auVar18._16_4_ = auVar82._16_4_ * 0.0;
  auVar18._20_4_ = auVar82._20_4_ * 0.0;
  auVar18._24_4_ = auVar82._24_4_ * 0.0;
  auVar18._28_4_ = auVar82._28_4_;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x17 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar3));
  auVar19._4_4_ = auVar282._4_4_ * auVar82._4_4_;
  auVar19._0_4_ = auVar282._0_4_ * auVar82._0_4_;
  auVar19._8_4_ = auVar282._8_4_ * auVar82._8_4_;
  auVar19._12_4_ = auVar282._12_4_ * auVar82._12_4_;
  auVar19._16_4_ = auVar82._16_4_ * 0.0;
  auVar19._20_4_ = auVar82._20_4_ * 0.0;
  auVar19._24_4_ = auVar82._24_4_ * 0.0;
  auVar19._28_4_ = auVar82._28_4_;
  auVar82 = vpminsd_avx2(auVar15,auVar155);
  auVar13 = vpminsd_avx2(auVar16,auVar17);
  auVar82 = vmaxps_avx(auVar82,auVar13);
  auVar13 = vpminsd_avx2(auVar18,auVar19);
  uVar75 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar230._4_4_ = uVar75;
  auVar230._0_4_ = uVar75;
  auVar230._8_4_ = uVar75;
  auVar230._12_4_ = uVar75;
  auVar230._16_4_ = uVar75;
  auVar230._20_4_ = uVar75;
  auVar230._24_4_ = uVar75;
  auVar230._28_4_ = uVar75;
  auVar13 = vmaxps_avx(auVar13,auVar230);
  auVar82 = vmaxps_avx(auVar82,auVar13);
  local_1d8._4_4_ = auVar82._4_4_ * 0.99999964;
  local_1d8._0_4_ = auVar82._0_4_ * 0.99999964;
  local_1d8._8_4_ = auVar82._8_4_ * 0.99999964;
  local_1d8._12_4_ = auVar82._12_4_ * 0.99999964;
  local_1d8._16_4_ = auVar82._16_4_ * 0.99999964;
  local_1d8._20_4_ = auVar82._20_4_ * 0.99999964;
  local_1d8._24_4_ = auVar82._24_4_ * 0.99999964;
  local_1d8._28_4_ = 0x3f7ffffa;
  auVar82 = vpmaxsd_avx2(auVar15,auVar155);
  auVar13 = vpmaxsd_avx2(auVar16,auVar17);
  auVar82 = vminps_avx(auVar82,auVar13);
  auVar13 = vpmaxsd_avx2(auVar18,auVar19);
  uVar75 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar114._4_4_ = uVar75;
  auVar114._0_4_ = uVar75;
  auVar114._8_4_ = uVar75;
  auVar114._12_4_ = uVar75;
  auVar114._16_4_ = uVar75;
  auVar114._20_4_ = uVar75;
  auVar114._24_4_ = uVar75;
  auVar114._28_4_ = uVar75;
  auVar13 = vminps_avx(auVar13,auVar114);
  auVar82 = vminps_avx(auVar82,auVar13);
  auVar13._4_4_ = auVar82._4_4_ * 1.0000004;
  auVar13._0_4_ = auVar82._0_4_ * 1.0000004;
  auVar13._8_4_ = auVar82._8_4_ * 1.0000004;
  auVar13._12_4_ = auVar82._12_4_ * 1.0000004;
  auVar13._16_4_ = auVar82._16_4_ * 1.0000004;
  auVar13._20_4_ = auVar82._20_4_ * 1.0000004;
  auVar13._24_4_ = auVar82._24_4_ * 1.0000004;
  auVar13._28_4_ = auVar82._28_4_;
  auVar97[4] = PVar7;
  auVar97._5_3_ = 0;
  auVar97[8] = PVar7;
  auVar97._9_3_ = 0;
  auVar97[0xc] = PVar7;
  auVar97._13_3_ = 0;
  auVar97[0x10] = PVar7;
  auVar97._17_3_ = 0;
  auVar97[0x14] = PVar7;
  auVar97._21_3_ = 0;
  auVar97[0x18] = PVar7;
  auVar97._25_3_ = 0;
  auVar97[0x1c] = PVar7;
  auVar97._29_3_ = 0;
  auVar82 = vcmpps_avx(local_1d8,auVar13,2);
  auVar13 = vpcmpgtd_avx2(auVar97,_DAT_0205a920);
  auVar82 = vandps_avx(auVar82,auVar13);
  uVar61 = vmovmskps_avx(auVar82);
  local_669 = uVar61 != 0;
  if (uVar61 == 0) {
    return local_669;
  }
  uVar61 = uVar61 & 0xff;
  auVar82._16_16_ = mm_lookupmask_ps._240_16_;
  auVar82._0_16_ = mm_lookupmask_ps._240_16_;
  local_2a8 = vblendps_avx(auVar82,ZEXT832(0) << 0x20,0x80);
  local_530 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_018b610e:
  lVar67 = 0;
  uVar72 = (ulong)uVar61;
  for (uVar65 = uVar72; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
    lVar67 = lVar67 + 1;
  }
  uVar61 = *(uint *)(prim + 2);
  local_398 = *(uint *)(prim + lVar67 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar61].ptr;
  uVar65 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_398);
  p_Var9 = pGVar8[1].intersectionFilterN;
  pvVar10 = pGVar8[2].userPtr;
  _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar5 = *(undefined1 (*) [16])(_Var11 + uVar65 * (long)pvVar10);
  auVar12 = *(undefined1 (*) [16])(_Var11 + (uVar65 + 1) * (long)pvVar10);
  auVar81 = *(undefined1 (*) [16])(_Var11 + (uVar65 + 2) * (long)pvVar10);
  pfVar1 = (float *)(_Var11 + (long)pvVar10 * (uVar65 + 3));
  fVar74 = *pfVar1;
  fVar84 = pfVar1[1];
  fVar143 = pfVar1[2];
  fVar157 = pfVar1[3];
  lVar67 = *(long *)&pGVar8[1].time_range.upper;
  auVar282 = *(undefined1 (*) [16])(lVar67 + (long)p_Var9 * uVar65);
  auVar3 = *(undefined1 (*) [16])(lVar67 + (long)p_Var9 * (uVar65 + 1));
  auVar4 = *(undefined1 (*) [16])(lVar67 + (long)p_Var9 * (uVar65 + 2));
  uVar72 = uVar72 - 1 & uVar72;
  pfVar1 = (float *)(lVar67 + (long)p_Var9 * (uVar65 + 3));
  fVar162 = *pfVar1;
  fVar182 = pfVar1[1];
  fVar185 = pfVar1[2];
  fVar187 = pfVar1[3];
  if (uVar72 != 0) {
    uVar70 = uVar72 - 1 & uVar72;
    for (uVar65 = uVar72; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
    }
    if (uVar70 != 0) {
      for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar287._8_4_ = 0x80000000;
  auVar287._0_8_ = 0x8000000080000000;
  auVar287._12_4_ = 0x80000000;
  auVar118._0_4_ = fVar162 * -0.0;
  auVar118._4_4_ = fVar182 * -0.0;
  auVar118._8_4_ = fVar185 * -0.0;
  auVar118._12_4_ = fVar187 * -0.0;
  auVar233 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar4,auVar118);
  auVar77._0_4_ = auVar3._0_4_ + auVar233._0_4_;
  auVar77._4_4_ = auVar3._4_4_ + auVar233._4_4_;
  auVar77._8_4_ = auVar3._8_4_ + auVar233._8_4_;
  auVar77._12_4_ = auVar3._12_4_ + auVar233._12_4_;
  auVar106 = vfmadd231ps_fma(auVar77,auVar282,auVar287);
  auVar86._12_4_ = 0;
  auVar86._0_12_ = ZEXT812(0);
  auVar86 = auVar86 << 0x20;
  auVar101._0_4_ = fVar162 * 0.0;
  auVar101._4_4_ = fVar182 * 0.0;
  auVar101._8_4_ = fVar185 * 0.0;
  auVar101._12_4_ = fVar187 * 0.0;
  auVar205._8_4_ = 0x3f000000;
  auVar205._0_8_ = 0x3f0000003f000000;
  auVar205._12_4_ = 0x3f000000;
  auVar233 = vfmadd231ps_fma(auVar101,auVar4,auVar205);
  auVar233 = vfmadd231ps_fma(auVar233,auVar3,auVar86);
  auVar20 = vfnmadd231ps_fma(auVar233,auVar282,auVar205);
  auVar279._0_4_ = fVar74 * -0.0;
  auVar279._4_4_ = fVar84 * -0.0;
  auVar279._8_4_ = fVar143 * -0.0;
  auVar279._12_4_ = fVar157 * -0.0;
  auVar233 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar81,auVar279);
  auVar267._0_4_ = auVar12._0_4_ + auVar233._0_4_;
  auVar267._4_4_ = auVar12._4_4_ + auVar233._4_4_;
  auVar267._8_4_ = auVar12._8_4_ + auVar233._8_4_;
  auVar267._12_4_ = auVar12._12_4_ + auVar233._12_4_;
  auVar233 = vfmadd231ps_fma(auVar267,auVar5,auVar287);
  auVar254._0_4_ = fVar74 * 0.0;
  auVar254._4_4_ = fVar84 * 0.0;
  auVar254._8_4_ = fVar143 * 0.0;
  auVar254._12_4_ = fVar157 * 0.0;
  auVar76 = vfmadd231ps_fma(auVar254,auVar81,auVar205);
  auVar76 = vfmadd231ps_fma(auVar76,auVar12,auVar86);
  auVar21 = vfnmadd231ps_fma(auVar76,auVar5,auVar205);
  auVar119._0_4_ = auVar4._0_4_ + auVar118._0_4_;
  auVar119._4_4_ = auVar4._4_4_ + auVar118._4_4_;
  auVar119._8_4_ = auVar4._8_4_ + auVar118._8_4_;
  auVar119._12_4_ = auVar4._12_4_ + auVar118._12_4_;
  auVar76 = vfmadd231ps_fma(auVar119,auVar3,auVar86);
  auVar76 = vfmadd231ps_fma(auVar76,auVar282,auVar287);
  auVar130._0_4_ = fVar162 * 0.5;
  auVar130._4_4_ = fVar182 * 0.5;
  auVar130._8_4_ = fVar185 * 0.5;
  auVar130._12_4_ = fVar187 * 0.5;
  auVar4 = vfmadd231ps_fma(auVar130,auVar86,auVar4);
  auVar3 = vfnmadd231ps_fma(auVar4,auVar205,auVar3);
  auVar210 = vfmadd231ps_fma(auVar3,auVar86,auVar282);
  auVar222._0_4_ = auVar279._0_4_ + auVar81._0_4_;
  auVar222._4_4_ = auVar279._4_4_ + auVar81._4_4_;
  auVar222._8_4_ = auVar279._8_4_ + auVar81._8_4_;
  auVar222._12_4_ = auVar279._12_4_ + auVar81._12_4_;
  auVar282 = vfmadd231ps_fma(auVar222,auVar12,auVar86);
  auVar4 = vfmadd231ps_fma(auVar282,auVar5,auVar287);
  auVar232._0_4_ = fVar74 * 0.5;
  auVar232._4_4_ = fVar84 * 0.5;
  auVar232._8_4_ = fVar143 * 0.5;
  auVar232._12_4_ = fVar157 * 0.5;
  auVar81 = vfmadd231ps_fma(auVar232,auVar86,auVar81);
  auVar12 = vfnmadd231ps_fma(auVar81,auVar205,auVar12);
  auVar5 = vfmadd231ps_fma(auVar12,auVar86,auVar5);
  auVar12 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar81 = vshufps_avx(auVar233,auVar233,0xc9);
  fVar158 = auVar20._0_4_;
  auVar164._0_4_ = fVar158 * auVar81._0_4_;
  fVar159 = auVar20._4_4_;
  auVar164._4_4_ = fVar159 * auVar81._4_4_;
  fVar100 = auVar20._8_4_;
  auVar164._8_4_ = fVar100 * auVar81._8_4_;
  fVar85 = auVar20._12_4_;
  auVar164._12_4_ = fVar85 * auVar81._12_4_;
  auVar81 = vfmsub231ps_fma(auVar164,auVar12,auVar233);
  auVar282 = vshufps_avx(auVar81,auVar81,0xc9);
  auVar81 = vshufps_avx(auVar21,auVar21,0xc9);
  auVar165._0_4_ = fVar158 * auVar81._0_4_;
  auVar165._4_4_ = fVar159 * auVar81._4_4_;
  auVar165._8_4_ = fVar100 * auVar81._8_4_;
  auVar165._12_4_ = fVar85 * auVar81._12_4_;
  auVar12 = vfmsub231ps_fma(auVar165,auVar12,auVar21);
  auVar3 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vshufps_avx(auVar210,auVar210,0xc9);
  auVar81 = vshufps_avx(auVar4,auVar4,0xc9);
  fVar144 = auVar210._0_4_;
  auVar145._0_4_ = fVar144 * auVar81._0_4_;
  fVar184 = auVar210._4_4_;
  auVar145._4_4_ = fVar184 * auVar81._4_4_;
  fVar160 = auVar210._8_4_;
  auVar145._8_4_ = fVar160 * auVar81._8_4_;
  fVar161 = auVar210._12_4_;
  auVar145._12_4_ = fVar161 * auVar81._12_4_;
  auVar81 = vfmsub231ps_fma(auVar145,auVar12,auVar4);
  auVar4 = vshufps_avx(auVar81,auVar81,0xc9);
  auVar81 = vshufps_avx(auVar5,auVar5,0xc9);
  auVar192._0_4_ = fVar144 * auVar81._0_4_;
  auVar192._4_4_ = fVar184 * auVar81._4_4_;
  auVar192._8_4_ = fVar160 * auVar81._8_4_;
  auVar192._12_4_ = fVar161 * auVar81._12_4_;
  auVar12 = vfmsub231ps_fma(auVar192,auVar12,auVar5);
  auVar5 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vdpps_avx(auVar282,auVar282,0x7f);
  fVar84 = auVar12._0_4_;
  auVar233 = ZEXT416((uint)fVar84);
  auVar81 = vrsqrtss_avx(auVar233,auVar233);
  fVar74 = auVar81._0_4_;
  fVar74 = fVar74 * 1.5 + fVar84 * -0.5 * fVar74 * fVar74 * fVar74;
  auVar81 = vdpps_avx(auVar282,auVar3,0x7f);
  fVar162 = auVar282._0_4_ * fVar74;
  fVar182 = auVar282._4_4_ * fVar74;
  fVar185 = auVar282._8_4_ * fVar74;
  fVar187 = auVar282._12_4_ * fVar74;
  auVar245._0_4_ = auVar3._0_4_ * fVar84;
  auVar245._4_4_ = auVar3._4_4_ * fVar84;
  auVar245._8_4_ = auVar3._8_4_ * fVar84;
  auVar245._12_4_ = auVar3._12_4_ * fVar84;
  fVar84 = auVar81._0_4_;
  auVar206._0_4_ = auVar282._0_4_ * fVar84;
  auVar206._4_4_ = auVar282._4_4_ * fVar84;
  auVar206._8_4_ = auVar282._8_4_ * fVar84;
  auVar206._12_4_ = auVar282._12_4_ * fVar84;
  auVar282 = vsubps_avx(auVar245,auVar206);
  auVar81 = vrcpss_avx(auVar233,auVar233);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar81,SUB6416(ZEXT464(0x40000000),0));
  fVar143 = auVar81._0_4_ * auVar12._0_4_;
  auVar12 = vdpps_avx(auVar4,auVar4,0x7f);
  fVar157 = auVar12._0_4_;
  auVar233 = ZEXT416((uint)fVar157);
  auVar81 = vrsqrtss_avx(auVar233,auVar233);
  fVar84 = auVar81._0_4_;
  auVar81 = vdpps_avx(auVar4,auVar5,0x7f);
  fVar84 = fVar84 * 1.5 + fVar157 * -0.5 * fVar84 * fVar84 * fVar84;
  fVar253 = fVar84 * auVar4._0_4_;
  fVar264 = fVar84 * auVar4._4_4_;
  fVar265 = fVar84 * auVar4._8_4_;
  fVar266 = fVar84 * auVar4._12_4_;
  auVar193._0_4_ = fVar157 * auVar5._0_4_;
  auVar193._4_4_ = fVar157 * auVar5._4_4_;
  auVar193._8_4_ = fVar157 * auVar5._8_4_;
  auVar193._12_4_ = fVar157 * auVar5._12_4_;
  fVar157 = auVar81._0_4_;
  auVar146._0_4_ = fVar157 * auVar4._0_4_;
  auVar146._4_4_ = fVar157 * auVar4._4_4_;
  auVar146._8_4_ = fVar157 * auVar4._8_4_;
  auVar146._12_4_ = fVar157 * auVar4._12_4_;
  auVar3 = vsubps_avx(auVar193,auVar146);
  auVar81 = vrcpss_avx(auVar233,auVar233);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar81,SUB6416(ZEXT464(0x40000000),0));
  fVar157 = auVar12._0_4_ * auVar81._0_4_;
  auVar12 = vshufps_avx(auVar106,auVar106,0xff);
  auVar223._0_4_ = auVar12._0_4_ * fVar162;
  auVar223._4_4_ = auVar12._4_4_ * fVar182;
  auVar223._8_4_ = auVar12._8_4_ * fVar185;
  auVar223._12_4_ = auVar12._12_4_ * fVar187;
  local_4c8 = vsubps_avx(auVar106,auVar223);
  auVar81 = vshufps_avx(auVar20,auVar20,0xff);
  auVar166._0_4_ = auVar81._0_4_ * fVar162 + fVar74 * auVar282._0_4_ * fVar143 * auVar12._0_4_;
  auVar166._4_4_ = auVar81._4_4_ * fVar182 + fVar74 * auVar282._4_4_ * fVar143 * auVar12._4_4_;
  auVar166._8_4_ = auVar81._8_4_ * fVar185 + fVar74 * auVar282._8_4_ * fVar143 * auVar12._8_4_;
  auVar166._12_4_ = auVar81._12_4_ * fVar187 + fVar74 * auVar282._12_4_ * fVar143 * auVar12._12_4_;
  auVar282 = vsubps_avx(auVar20,auVar166);
  local_4d8._0_4_ = auVar223._0_4_ + auVar106._0_4_;
  local_4d8._4_4_ = auVar223._4_4_ + auVar106._4_4_;
  fStack_4d0 = auVar223._8_4_ + auVar106._8_4_;
  fStack_4cc = auVar223._12_4_ + auVar106._12_4_;
  auVar12 = vshufps_avx(auVar76,auVar76,0xff);
  auVar102._0_4_ = fVar253 * auVar12._0_4_;
  auVar102._4_4_ = fVar264 * auVar12._4_4_;
  auVar102._8_4_ = fVar265 * auVar12._8_4_;
  auVar102._12_4_ = fVar266 * auVar12._12_4_;
  local_4e8 = vsubps_avx(auVar76,auVar102);
  auVar81 = vshufps_avx(auVar210,auVar210,0xff);
  auVar87._0_4_ = fVar253 * auVar81._0_4_ + auVar12._0_4_ * fVar84 * auVar3._0_4_ * fVar157;
  auVar87._4_4_ = fVar264 * auVar81._4_4_ + auVar12._4_4_ * fVar84 * auVar3._4_4_ * fVar157;
  auVar87._8_4_ = fVar265 * auVar81._8_4_ + auVar12._8_4_ * fVar84 * auVar3._8_4_ * fVar157;
  auVar87._12_4_ = fVar266 * auVar81._12_4_ + auVar12._12_4_ * fVar84 * auVar3._12_4_ * fVar157;
  auVar12 = vsubps_avx(auVar210,auVar87);
  fVar162 = auVar76._0_4_ + auVar102._0_4_;
  fVar182 = auVar76._4_4_ + auVar102._4_4_;
  fVar185 = auVar76._8_4_ + auVar102._8_4_;
  fVar187 = auVar76._12_4_ + auVar102._12_4_;
  local_4f8._0_4_ = local_4c8._0_4_ + auVar282._0_4_ * 0.33333334;
  local_4f8._4_4_ = local_4c8._4_4_ + auVar282._4_4_ * 0.33333334;
  local_4f8._8_4_ = local_4c8._8_4_ + auVar282._8_4_ * 0.33333334;
  local_4f8._12_4_ = local_4c8._12_4_ + auVar282._12_4_ * 0.33333334;
  auVar88._0_4_ = auVar12._0_4_ * 0.33333334;
  auVar88._4_4_ = auVar12._4_4_ * 0.33333334;
  auVar88._8_4_ = auVar12._8_4_ * 0.33333334;
  auVar88._12_4_ = auVar12._12_4_ * 0.33333334;
  local_508 = vsubps_avx(local_4e8,auVar88);
  local_4a8 = vsubps_avx(local_4c8,auVar6);
  auVar12 = vshufps_avx(local_4a8,local_4a8,0x55);
  auVar81 = vshufps_avx(local_4a8,local_4a8,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar74 = pre->ray_space[k].vz.field_0.m128[0];
  fVar84 = pre->ray_space[k].vz.field_0.m128[1];
  fVar143 = pre->ray_space[k].vz.field_0.m128[2];
  fVar157 = pre->ray_space[k].vz.field_0.m128[3];
  auVar89._0_4_ = fVar74 * auVar81._0_4_;
  auVar89._4_4_ = fVar84 * auVar81._4_4_;
  auVar89._8_4_ = fVar143 * auVar81._8_4_;
  auVar89._12_4_ = fVar157 * auVar81._12_4_;
  auVar282 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar2,auVar12);
  local_4b8 = vsubps_avx(local_4f8,auVar6);
  auVar12 = vshufps_avx(local_4b8,local_4b8,0x55);
  auVar81 = vshufps_avx(local_4b8,local_4b8,0xaa);
  auVar288._0_4_ = fVar74 * auVar81._0_4_;
  auVar288._4_4_ = fVar84 * auVar81._4_4_;
  auVar288._8_4_ = fVar143 * auVar81._8_4_;
  auVar288._12_4_ = fVar157 * auVar81._12_4_;
  auVar81 = vfmadd231ps_fma(auVar288,(undefined1  [16])aVar2,auVar12);
  local_318 = vsubps_avx(local_508,auVar6);
  auVar12 = vshufps_avx(local_318,local_318,0xaa);
  auVar255._0_4_ = fVar74 * auVar12._0_4_;
  auVar255._4_4_ = fVar84 * auVar12._4_4_;
  auVar255._8_4_ = fVar143 * auVar12._8_4_;
  auVar255._12_4_ = fVar157 * auVar12._12_4_;
  auVar12 = vshufps_avx(local_318,local_318,0x55);
  auVar3 = vfmadd231ps_fma(auVar255,(undefined1  [16])aVar2,auVar12);
  local_328 = vsubps_avx(local_4e8,auVar6);
  auVar12 = vshufps_avx(local_328,local_328,0xaa);
  auVar280._0_4_ = fVar74 * auVar12._0_4_;
  auVar280._4_4_ = fVar84 * auVar12._4_4_;
  auVar280._8_4_ = fVar143 * auVar12._8_4_;
  auVar280._12_4_ = fVar157 * auVar12._12_4_;
  auVar12 = vshufps_avx(local_328,local_328,0x55);
  auVar4 = vfmadd231ps_fma(auVar280,(undefined1  [16])aVar2,auVar12);
  local_338 = vsubps_avx(_local_4d8,auVar6);
  auVar12 = vshufps_avx(local_338,local_338,0xaa);
  auVar147._0_4_ = fVar74 * auVar12._0_4_;
  auVar147._4_4_ = fVar84 * auVar12._4_4_;
  auVar147._8_4_ = fVar143 * auVar12._8_4_;
  auVar147._12_4_ = fVar157 * auVar12._12_4_;
  auVar12 = vshufps_avx(local_338,local_338,0x55);
  auVar5 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar2,auVar12);
  local_518._0_4_ = (fVar158 + auVar166._0_4_) * 0.33333334 + (float)local_4d8._0_4_;
  local_518._4_4_ = (fVar159 + auVar166._4_4_) * 0.33333334 + (float)local_4d8._4_4_;
  fStack_510 = (fVar100 + auVar166._8_4_) * 0.33333334 + fStack_4d0;
  fStack_50c = (fVar85 + auVar166._12_4_) * 0.33333334 + fStack_4cc;
  local_348 = vsubps_avx(_local_518,auVar6);
  auVar12 = vshufps_avx(local_348,local_348,0xaa);
  auVar207._0_4_ = auVar12._0_4_ * fVar74;
  auVar207._4_4_ = auVar12._4_4_ * fVar84;
  auVar207._8_4_ = auVar12._8_4_ * fVar143;
  auVar207._12_4_ = auVar12._12_4_ * fVar157;
  auVar12 = vshufps_avx(local_348,local_348,0x55);
  auVar233 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar2,auVar12);
  auVar224._0_4_ = (fVar144 + auVar87._0_4_) * 0.33333334;
  auVar224._4_4_ = (fVar184 + auVar87._4_4_) * 0.33333334;
  auVar224._8_4_ = (fVar160 + auVar87._8_4_) * 0.33333334;
  auVar224._12_4_ = (fVar161 + auVar87._12_4_) * 0.33333334;
  auVar20._4_4_ = fVar182;
  auVar20._0_4_ = fVar162;
  auVar20._8_4_ = fVar185;
  auVar20._12_4_ = fVar187;
  _local_528 = vsubps_avx(auVar20,auVar224);
  local_358 = vsubps_avx(_local_528,auVar6);
  auVar12 = vshufps_avx(local_358,local_358,0xaa);
  auVar225._0_4_ = auVar12._0_4_ * fVar74;
  auVar225._4_4_ = auVar12._4_4_ * fVar84;
  auVar225._8_4_ = auVar12._8_4_ * fVar143;
  auVar225._12_4_ = auVar12._12_4_ * fVar157;
  auVar12 = vshufps_avx(local_358,local_358,0x55);
  auVar106 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar2,auVar12);
  local_368 = vsubps_avx(auVar20,auVar6);
  auVar12 = vshufps_avx(local_368,local_368,0xaa);
  auVar78._0_4_ = fVar74 * auVar12._0_4_;
  auVar78._4_4_ = fVar84 * auVar12._4_4_;
  auVar78._8_4_ = fVar143 * auVar12._8_4_;
  auVar78._12_4_ = fVar157 * auVar12._12_4_;
  auVar12 = vshufps_avx(local_368,local_368,0x55);
  auVar12 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar2,auVar12);
  auVar167._4_4_ = local_4a8._0_4_;
  auVar167._0_4_ = local_4a8._0_4_;
  auVar167._8_4_ = local_4a8._0_4_;
  auVar167._12_4_ = local_4a8._0_4_;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar6 = vfmadd231ps_fma(auVar282,(undefined1  [16])aVar2,auVar167);
  auVar168._4_4_ = local_4b8._0_4_;
  auVar168._0_4_ = local_4b8._0_4_;
  auVar168._8_4_ = local_4b8._0_4_;
  auVar168._12_4_ = local_4b8._0_4_;
  auVar76 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar2,auVar168);
  uVar75 = local_318._0_4_;
  auVar169._4_4_ = uVar75;
  auVar169._0_4_ = uVar75;
  auVar169._8_4_ = uVar75;
  auVar169._12_4_ = uVar75;
  auVar210 = vfmadd231ps_fma(auVar3,(undefined1  [16])aVar2,auVar169);
  uVar75 = local_328._0_4_;
  auVar170._4_4_ = uVar75;
  auVar170._0_4_ = uVar75;
  auVar170._8_4_ = uVar75;
  auVar170._12_4_ = uVar75;
  auVar20 = vfmadd231ps_fma(auVar4,(undefined1  [16])aVar2,auVar170);
  uVar75 = local_338._0_4_;
  auVar171._4_4_ = uVar75;
  auVar171._0_4_ = uVar75;
  auVar171._8_4_ = uVar75;
  auVar171._12_4_ = uVar75;
  auVar21 = vfmadd231ps_fma(auVar5,(undefined1  [16])aVar2,auVar171);
  uVar75 = local_348._0_4_;
  auVar172._4_4_ = uVar75;
  auVar172._0_4_ = uVar75;
  auVar172._8_4_ = uVar75;
  auVar172._12_4_ = uVar75;
  auVar233 = vfmadd231ps_fma(auVar233,(undefined1  [16])aVar2,auVar172);
  uVar75 = local_358._0_4_;
  auVar173._4_4_ = uVar75;
  auVar173._0_4_ = uVar75;
  auVar173._8_4_ = uVar75;
  auVar173._12_4_ = uVar75;
  auVar106 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar2,auVar173);
  uVar75 = local_368._0_4_;
  auVar174._4_4_ = uVar75;
  auVar174._0_4_ = uVar75;
  auVar174._8_4_ = uVar75;
  auVar174._12_4_ = uVar75;
  auVar86 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar174);
  auVar3 = vmovlhps_avx(auVar6,auVar21);
  auVar4 = vmovlhps_avx(auVar76,auVar233);
  auVar5 = vmovlhps_avx(auVar210,auVar106);
  _local_308 = vmovlhps_avx(auVar20,auVar86);
  auVar12 = vminps_avx(auVar3,auVar4);
  auVar81 = vminps_avx(auVar5,_local_308);
  auVar282 = vminps_avx(auVar12,auVar81);
  auVar12 = vmaxps_avx(auVar3,auVar4);
  auVar81 = vmaxps_avx(auVar5,_local_308);
  auVar12 = vmaxps_avx(auVar12,auVar81);
  auVar81 = vshufpd_avx(auVar282,auVar282,3);
  auVar282 = vminps_avx(auVar282,auVar81);
  auVar81 = vshufpd_avx(auVar12,auVar12,3);
  auVar81 = vmaxps_avx(auVar12,auVar81);
  auVar133._8_4_ = 0x7fffffff;
  auVar133._0_8_ = 0x7fffffff7fffffff;
  auVar133._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar133,auVar282);
  auVar81 = vandps_avx(auVar133,auVar81);
  auVar12 = vmaxps_avx(auVar12,auVar81);
  auVar81 = vmovshdup_avx(auVar12);
  auVar12 = vmaxss_avx(auVar81,auVar12);
  fVar84 = auVar12._0_4_ * 9.536743e-07;
  local_428._8_8_ = auVar6._0_8_;
  local_428._0_8_ = auVar6._0_8_;
  local_438._8_8_ = auVar76._0_8_;
  local_438._0_8_ = auVar76._0_8_;
  local_448._0_8_ = auVar210._0_8_;
  local_448._8_8_ = local_448._0_8_;
  local_458._8_8_ = auVar20._0_8_;
  local_458._0_8_ = auVar20._0_8_;
  local_468 = auVar21._0_8_;
  register0x00001348 = local_468;
  register0x000013c8 = auVar233._0_8_;
  local_478 = auVar233._0_8_;
  register0x00001408 = auVar106._0_8_;
  local_488 = auVar106._0_8_;
  register0x00001448 = auVar86._0_8_;
  local_498 = auVar86._0_8_;
  local_198 = fVar84;
  fStack_194 = fVar84;
  fStack_190 = fVar84;
  fStack_18c = fVar84;
  fStack_188 = fVar84;
  fStack_184 = fVar84;
  fStack_180 = fVar84;
  fStack_17c = fVar84;
  fStack_1b0 = -fVar84;
  local_1b8 = -fVar84;
  fStack_1b4 = -fVar84;
  fStack_1ac = fStack_1b0;
  fStack_1a8 = fStack_1b0;
  fStack_1a4 = fStack_1b0;
  fStack_1a0 = fStack_1b0;
  fStack_19c = fStack_1b0;
  local_388 = uVar61;
  uStack_384 = uVar61;
  uStack_380 = uVar61;
  uStack_37c = uVar61;
  uStack_394 = local_398;
  uStack_390 = local_398;
  uStack_38c = local_398;
  bVar71 = false;
  uVar65 = 0;
  fVar74 = *(float *)(ray + k * 4 + 0x30);
  local_2d8 = vsubps_avx(auVar4,auVar3);
  local_2e8 = vsubps_avx(auVar5,auVar4);
  local_2f8 = vsubps_avx(_local_308,auVar5);
  local_3a8 = vsubps_avx(_local_4d8,local_4c8);
  local_3b8 = vsubps_avx(_local_518,local_4f8);
  local_3c8 = vsubps_avx(_local_528,local_508);
  auVar21._4_4_ = fVar182;
  auVar21._0_4_ = fVar162;
  auVar21._8_4_ = fVar185;
  auVar21._12_4_ = fVar187;
  _local_3d8 = vsubps_avx(auVar21,local_4e8);
  local_668 = ZEXT816(0x3f80000000000000);
  local_378 = local_668;
  do {
    auVar12 = vshufps_avx(local_668,local_668,0x50);
    auVar120._8_4_ = 0x3f800000;
    auVar120._0_8_ = &DAT_3f8000003f800000;
    auVar120._12_4_ = 0x3f800000;
    auVar127._16_4_ = 0x3f800000;
    auVar127._0_16_ = auVar120;
    auVar127._20_4_ = 0x3f800000;
    auVar127._24_4_ = 0x3f800000;
    auVar127._28_4_ = 0x3f800000;
    auVar81 = vsubps_avx(auVar120,auVar12);
    fVar143 = auVar12._0_4_;
    auVar79._0_4_ = local_468._0_4_ * fVar143;
    fVar157 = auVar12._4_4_;
    auVar79._4_4_ = local_468._4_4_ * fVar157;
    fVar158 = auVar12._8_4_;
    auVar79._8_4_ = local_468._8_4_ * fVar158;
    fVar159 = auVar12._12_4_;
    auVar79._12_4_ = local_468._12_4_ * fVar159;
    auVar148._0_4_ = local_478._0_4_ * fVar143;
    auVar148._4_4_ = local_478._4_4_ * fVar157;
    auVar148._8_4_ = local_478._8_4_ * fVar158;
    auVar148._12_4_ = local_478._12_4_ * fVar159;
    auVar194._0_4_ = local_488._0_4_ * fVar143;
    auVar194._4_4_ = local_488._4_4_ * fVar157;
    auVar194._8_4_ = local_488._8_4_ * fVar158;
    auVar194._12_4_ = local_488._12_4_ * fVar159;
    auVar281._0_4_ = local_498._0_4_ * fVar143;
    auVar281._4_4_ = local_498._4_4_ * fVar157;
    auVar281._8_4_ = local_498._8_4_ * fVar158;
    auVar281._12_4_ = local_498._12_4_ * fVar159;
    auVar233 = vfmadd231ps_fma(auVar79,auVar81,local_428);
    auVar106 = vfmadd231ps_fma(auVar148,auVar81,local_438);
    auVar76 = vfmadd231ps_fma(auVar194,auVar81,local_448);
    auVar210 = vfmadd231ps_fma(auVar281,local_458,auVar81);
    local_5c8 = auVar210._0_4_;
    auVar12 = vmovshdup_avx(local_378);
    fVar143 = local_378._0_4_;
    fVar100 = (auVar12._0_4_ - fVar143) * 0.04761905;
    auVar221._4_4_ = fVar143;
    auVar221._0_4_ = fVar143;
    auVar221._8_4_ = fVar143;
    auVar221._12_4_ = fVar143;
    auVar221._16_4_ = fVar143;
    auVar221._20_4_ = fVar143;
    auVar221._24_4_ = fVar143;
    auVar221._28_4_ = fVar143;
    auVar115._0_8_ = auVar12._0_8_;
    auVar115._8_8_ = auVar115._0_8_;
    auVar115._16_8_ = auVar115._0_8_;
    auVar115._24_8_ = auVar115._0_8_;
    auVar82 = vsubps_avx(auVar115,auVar221);
    uVar75 = auVar233._0_4_;
    auVar294._4_4_ = uVar75;
    auVar294._0_4_ = uVar75;
    auVar294._8_4_ = uVar75;
    auVar294._12_4_ = uVar75;
    auVar294._16_4_ = uVar75;
    auVar294._20_4_ = uVar75;
    auVar294._24_4_ = uVar75;
    auVar294._28_4_ = uVar75;
    auVar12 = vmovshdup_avx(auVar233);
    uVar163 = auVar12._0_8_;
    auVar277._8_8_ = uVar163;
    auVar277._0_8_ = uVar163;
    auVar277._16_8_ = uVar163;
    auVar277._24_8_ = uVar163;
    fVar85 = auVar106._0_4_;
    auVar98._4_4_ = fVar85;
    auVar98._0_4_ = fVar85;
    auVar98._8_4_ = fVar85;
    auVar98._12_4_ = fVar85;
    auVar98._16_4_ = fVar85;
    auVar98._20_4_ = fVar85;
    auVar98._24_4_ = fVar85;
    auVar98._28_4_ = fVar85;
    auVar81 = vmovshdup_avx(auVar106);
    auVar179._0_8_ = auVar81._0_8_;
    auVar179._8_8_ = auVar179._0_8_;
    auVar179._16_8_ = auVar179._0_8_;
    auVar179._24_8_ = auVar179._0_8_;
    fVar160 = auVar76._0_4_;
    auVar252._4_4_ = fVar160;
    auVar252._0_4_ = fVar160;
    auVar252._8_4_ = fVar160;
    auVar252._12_4_ = fVar160;
    auVar252._16_4_ = fVar160;
    auVar252._20_4_ = fVar160;
    auVar252._24_4_ = fVar160;
    auVar252._28_4_ = fVar160;
    auVar282 = vmovshdup_avx(auVar76);
    auVar231._0_8_ = auVar282._0_8_;
    auVar231._8_8_ = auVar231._0_8_;
    auVar231._16_8_ = auVar231._0_8_;
    auVar231._24_8_ = auVar231._0_8_;
    auVar6 = vmovshdup_avx(auVar210);
    auVar20 = vfmadd132ps_fma(auVar82,auVar221,_DAT_02020f20);
    auVar82 = vsubps_avx(auVar127,ZEXT1632(auVar20));
    fVar143 = auVar20._0_4_;
    auVar284._0_4_ = fVar85 * fVar143;
    fVar157 = auVar20._4_4_;
    auVar284._4_4_ = fVar85 * fVar157;
    fVar158 = auVar20._8_4_;
    auVar284._8_4_ = fVar85 * fVar158;
    fVar159 = auVar20._12_4_;
    auVar284._12_4_ = fVar85 * fVar159;
    auVar284._16_4_ = fVar85 * 0.0;
    auVar284._20_4_ = fVar85 * 0.0;
    auVar284._24_4_ = fVar85 * 0.0;
    auVar284._28_4_ = 0;
    auVar20 = vfmadd231ps_fma(auVar284,auVar82,auVar294);
    fVar144 = auVar81._0_4_;
    auVar261._0_4_ = fVar144 * fVar143;
    fVar184 = auVar81._4_4_;
    auVar261._4_4_ = fVar184 * fVar157;
    auVar261._8_4_ = fVar144 * fVar158;
    auVar261._12_4_ = fVar184 * fVar159;
    auVar261._16_4_ = fVar144 * 0.0;
    auVar261._20_4_ = fVar184 * 0.0;
    auVar261._24_4_ = fVar144 * 0.0;
    auVar261._28_4_ = 0;
    auVar21 = vfmadd231ps_fma(auVar261,auVar82,auVar277);
    auVar23._4_4_ = fVar160 * fVar157;
    auVar23._0_4_ = fVar160 * fVar143;
    auVar23._8_4_ = fVar160 * fVar158;
    auVar23._12_4_ = fVar160 * fVar159;
    auVar23._16_4_ = fVar160 * 0.0;
    auVar23._20_4_ = fVar160 * 0.0;
    auVar23._24_4_ = fVar160 * 0.0;
    auVar23._28_4_ = auVar12._4_4_;
    auVar86 = vfmadd231ps_fma(auVar23,auVar82,auVar98);
    fVar144 = auVar282._0_4_;
    fVar184 = auVar282._4_4_;
    auVar24._4_4_ = fVar184 * fVar157;
    auVar24._0_4_ = fVar144 * fVar143;
    auVar24._8_4_ = fVar144 * fVar158;
    auVar24._12_4_ = fVar184 * fVar159;
    auVar24._16_4_ = fVar144 * 0.0;
    auVar24._20_4_ = fVar184 * 0.0;
    auVar24._24_4_ = fVar144 * 0.0;
    auVar24._28_4_ = uVar75;
    auVar133 = vfmadd231ps_fma(auVar24,auVar82,auVar179);
    auVar12 = vshufps_avx(auVar233,auVar233,0xaa);
    auVar180._0_8_ = auVar12._0_8_;
    auVar180._8_8_ = auVar180._0_8_;
    auVar180._16_8_ = auVar180._0_8_;
    auVar180._24_8_ = auVar180._0_8_;
    auVar81 = vshufps_avx(auVar233,auVar233,0xff);
    uStack_600 = auVar81._0_8_;
    local_608 = (undefined1  [8])uStack_600;
    uStack_5f8 = uStack_600;
    uStack_5f0 = uStack_600;
    auVar25._4_4_ = fVar157 * local_5c8;
    auVar25._0_4_ = fVar143 * local_5c8;
    auVar25._8_4_ = fVar158 * local_5c8;
    auVar25._12_4_ = fVar159 * local_5c8;
    auVar25._16_4_ = local_5c8 * 0.0;
    auVar25._20_4_ = local_5c8 * 0.0;
    auVar25._24_4_ = local_5c8 * 0.0;
    auVar25._28_4_ = 0x3f800000;
    auVar77 = vfmadd231ps_fma(auVar25,auVar82,auVar252);
    auVar282 = vshufps_avx(auVar106,auVar106,0xaa);
    auVar141._0_8_ = auVar282._0_8_;
    auVar141._8_8_ = auVar141._0_8_;
    auVar141._16_8_ = auVar141._0_8_;
    auVar141._24_8_ = auVar141._0_8_;
    auVar233 = vshufps_avx(auVar106,auVar106,0xff);
    auVar156._0_8_ = auVar233._0_8_;
    auVar156._8_8_ = auVar156._0_8_;
    auVar156._16_8_ = auVar156._0_8_;
    auVar156._24_8_ = auVar156._0_8_;
    fVar144 = auVar6._0_4_;
    fVar184 = auVar6._4_4_;
    auVar26._4_4_ = fVar184 * fVar157;
    auVar26._0_4_ = fVar144 * fVar143;
    auVar26._8_4_ = fVar144 * fVar158;
    auVar26._12_4_ = fVar184 * fVar159;
    auVar26._16_4_ = fVar144 * 0.0;
    auVar26._20_4_ = fVar184 * 0.0;
    auVar26._24_4_ = fVar144 * 0.0;
    auVar26._28_4_ = fVar160;
    auVar78 = vfmadd231ps_fma(auVar26,auVar82,auVar231);
    auVar27._28_4_ = fVar85;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar86._12_4_ * fVar159,
                            CONCAT48(auVar86._8_4_ * fVar158,
                                     CONCAT44(auVar86._4_4_ * fVar157,auVar86._0_4_ * fVar143))));
    auVar20 = vfmadd231ps_fma(auVar27,auVar82,ZEXT1632(auVar20));
    auVar28._28_4_ = auVar81._4_4_;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(auVar133._12_4_ * fVar159,
                            CONCAT48(auVar133._8_4_ * fVar158,
                                     CONCAT44(auVar133._4_4_ * fVar157,auVar133._0_4_ * fVar143))));
    auVar21 = vfmadd231ps_fma(auVar28,auVar82,ZEXT1632(auVar21));
    auVar81 = vshufps_avx(auVar76,auVar76,0xaa);
    uVar163 = auVar81._0_8_;
    auVar262._8_8_ = uVar163;
    auVar262._0_8_ = uVar163;
    auVar262._16_8_ = uVar163;
    auVar262._24_8_ = uVar163;
    auVar6 = vshufps_avx(auVar76,auVar76,0xff);
    uVar163 = auVar6._0_8_;
    auVar285._8_8_ = uVar163;
    auVar285._0_8_ = uVar163;
    auVar285._16_8_ = uVar163;
    auVar285._24_8_ = uVar163;
    auVar86 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar159 * auVar77._12_4_,
                                                 CONCAT48(fVar158 * auVar77._8_4_,
                                                          CONCAT44(fVar157 * auVar77._4_4_,
                                                                   fVar143 * auVar77._0_4_)))),
                              auVar82,ZEXT1632(auVar86));
    auVar106 = vshufps_avx(auVar210,auVar210,0xaa);
    auVar76 = vshufps_avx(auVar210,auVar210,0xff);
    local_5c8 = auVar76._0_4_;
    fStack_5c4 = auVar76._4_4_;
    auVar29._28_4_ = fStack_5c4;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(auVar78._12_4_ * fVar159,
                            CONCAT48(auVar78._8_4_ * fVar158,
                                     CONCAT44(auVar78._4_4_ * fVar157,auVar78._0_4_ * fVar143))));
    auVar76 = vfmadd231ps_fma(auVar29,auVar82,ZEXT1632(auVar133));
    auVar210 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar159 * auVar86._12_4_,
                                                  CONCAT48(fVar158 * auVar86._8_4_,
                                                           CONCAT44(fVar157 * auVar86._4_4_,
                                                                    fVar143 * auVar86._0_4_)))),
                               auVar82,ZEXT1632(auVar20));
    auVar13 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar20));
    auVar20 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar159 * auVar76._12_4_,
                                                 CONCAT48(fVar158 * auVar76._8_4_,
                                                          CONCAT44(fVar157 * auVar76._4_4_,
                                                                   fVar143 * auVar76._0_4_)))),
                              auVar82,ZEXT1632(auVar21));
    auVar14 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar21));
    fVar264 = fVar100 * auVar13._0_4_ * 3.0;
    fVar266 = fVar100 * auVar13._4_4_ * 3.0;
    auVar30._4_4_ = fVar266;
    auVar30._0_4_ = fVar264;
    fVar240 = fVar100 * auVar13._8_4_ * 3.0;
    auVar30._8_4_ = fVar240;
    fVar241 = fVar100 * auVar13._12_4_ * 3.0;
    auVar30._12_4_ = fVar241;
    fVar242 = fVar100 * auVar13._16_4_ * 3.0;
    auVar30._16_4_ = fVar242;
    fVar243 = fVar100 * auVar13._20_4_ * 3.0;
    auVar30._20_4_ = fVar243;
    fVar244 = fVar100 * auVar13._24_4_ * 3.0;
    auVar30._24_4_ = fVar244;
    auVar30._28_4_ = 0x40400000;
    local_5e8._0_4_ = fVar100 * auVar14._0_4_ * 3.0;
    local_5e8._4_4_ = fVar100 * auVar14._4_4_ * 3.0;
    fStack_5e0 = fVar100 * auVar14._8_4_ * 3.0;
    fStack_5dc = fVar100 * auVar14._12_4_ * 3.0;
    fStack_5d8 = fVar100 * auVar14._16_4_ * 3.0;
    fStack_5d4 = fVar100 * auVar14._20_4_ * 3.0;
    fStack_5d0 = fVar100 * auVar14._24_4_ * 3.0;
    fStack_5cc = auVar14._28_4_;
    fVar85 = auVar282._0_4_;
    fVar144 = auVar282._4_4_;
    auVar31._4_4_ = fVar144 * fVar157;
    auVar31._0_4_ = fVar85 * fVar143;
    auVar31._8_4_ = fVar85 * fVar158;
    auVar31._12_4_ = fVar144 * fVar159;
    auVar31._16_4_ = fVar85 * 0.0;
    auVar31._20_4_ = fVar144 * 0.0;
    auVar31._24_4_ = fVar85 * 0.0;
    auVar31._28_4_ = auVar13._28_4_;
    auVar282 = vfmadd231ps_fma(auVar31,auVar82,auVar180);
    fVar85 = auVar233._0_4_;
    fVar184 = auVar233._4_4_;
    auVar32._4_4_ = fVar184 * fVar157;
    auVar32._0_4_ = fVar85 * fVar143;
    auVar32._8_4_ = fVar85 * fVar158;
    auVar32._12_4_ = fVar184 * fVar159;
    auVar32._16_4_ = fVar85 * 0.0;
    auVar32._20_4_ = fVar184 * 0.0;
    auVar32._24_4_ = fVar85 * 0.0;
    auVar32._28_4_ = auVar12._4_4_;
    auVar12 = vfmadd231ps_fma(auVar32,auVar82,_local_608);
    fVar85 = auVar81._0_4_;
    fVar184 = auVar81._4_4_;
    auVar33._4_4_ = fVar184 * fVar157;
    auVar33._0_4_ = fVar85 * fVar143;
    auVar33._8_4_ = fVar85 * fVar158;
    auVar33._12_4_ = fVar184 * fVar159;
    auVar33._16_4_ = fVar85 * 0.0;
    auVar33._20_4_ = fVar184 * 0.0;
    auVar33._24_4_ = fVar85 * 0.0;
    auVar33._28_4_ = fVar100;
    auVar81 = vfmadd231ps_fma(auVar33,auVar82,auVar141);
    fVar85 = auVar6._0_4_;
    fVar160 = auVar6._4_4_;
    auVar34._4_4_ = fVar160 * fVar157;
    auVar34._0_4_ = fVar85 * fVar143;
    auVar34._8_4_ = fVar85 * fVar158;
    auVar34._12_4_ = fVar160 * fVar159;
    auVar34._16_4_ = fVar85 * 0.0;
    auVar34._20_4_ = fVar160 * 0.0;
    auVar34._24_4_ = fVar85 * 0.0;
    auVar34._28_4_ = fVar144;
    auVar6 = vfmadd231ps_fma(auVar34,auVar82,auVar156);
    local_2c8 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar210));
    fVar85 = auVar106._0_4_;
    fVar144 = auVar106._4_4_;
    auVar35._4_4_ = fVar144 * fVar157;
    auVar35._0_4_ = fVar85 * fVar143;
    auVar35._8_4_ = fVar85 * fVar158;
    auVar35._12_4_ = fVar144 * fVar159;
    auVar35._16_4_ = fVar85 * 0.0;
    auVar35._20_4_ = fVar144 * 0.0;
    auVar35._24_4_ = fVar85 * 0.0;
    auVar35._28_4_ = local_2c8._28_4_;
    auVar233 = vfmadd231ps_fma(auVar35,auVar82,auVar262);
    auVar17 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar20));
    auVar36._4_4_ = fVar157 * fStack_5c4;
    auVar36._0_4_ = fVar143 * local_5c8;
    auVar36._8_4_ = fVar158 * local_5c8;
    auVar36._12_4_ = fVar159 * fStack_5c4;
    auVar36._16_4_ = local_5c8 * 0.0;
    auVar36._20_4_ = fStack_5c4 * 0.0;
    auVar36._24_4_ = local_5c8 * 0.0;
    auVar36._28_4_ = fVar184;
    auVar106 = vfmadd231ps_fma(auVar36,auVar82,auVar285);
    auVar37._28_4_ = fVar144;
    auVar37._0_28_ =
         ZEXT1628(CONCAT412(fVar159 * auVar81._12_4_,
                            CONCAT48(fVar158 * auVar81._8_4_,
                                     CONCAT44(fVar157 * auVar81._4_4_,fVar143 * auVar81._0_4_))));
    auVar282 = vfmadd231ps_fma(auVar37,auVar82,ZEXT1632(auVar282));
    auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar159 * auVar6._12_4_,
                                                 CONCAT48(fVar158 * auVar6._8_4_,
                                                          CONCAT44(fVar157 * auVar6._4_4_,
                                                                   fVar143 * auVar6._0_4_)))),
                              auVar82,ZEXT1632(auVar12));
    fVar264 = auVar210._0_4_ + fVar264;
    fVar266 = auVar210._4_4_ + fVar266;
    fVar240 = auVar210._8_4_ + fVar240;
    fVar241 = auVar210._12_4_ + fVar241;
    fVar242 = fVar242 + 0.0;
    fVar243 = fVar243 + 0.0;
    fVar244 = fVar244 + 0.0;
    auVar38._28_4_ = 0x40400000;
    auVar38._0_28_ =
         ZEXT1628(CONCAT412(auVar106._12_4_ * fVar159,
                            CONCAT48(auVar106._8_4_ * fVar158,
                                     CONCAT44(auVar106._4_4_ * fVar157,auVar106._0_4_ * fVar143))));
    auVar81 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar159 * auVar233._12_4_,
                                                 CONCAT48(fVar158 * auVar233._8_4_,
                                                          CONCAT44(fVar157 * auVar233._4_4_,
                                                                   fVar143 * auVar233._0_4_)))),
                              auVar82,ZEXT1632(auVar81));
    auVar6 = vfmadd231ps_fma(auVar38,auVar82,ZEXT1632(auVar6));
    auVar233 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar159 * auVar81._12_4_,
                                                  CONCAT48(fVar158 * auVar81._8_4_,
                                                           CONCAT44(fVar157 * auVar81._4_4_,
                                                                    fVar143 * auVar81._0_4_)))),
                               auVar82,ZEXT1632(auVar282));
    auVar106 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar159 * auVar6._12_4_,
                                                  CONCAT48(fVar158 * auVar6._8_4_,
                                                           CONCAT44(fVar157 * auVar6._4_4_,
                                                                    fVar143 * auVar6._0_4_)))),
                               ZEXT1632(auVar12),auVar82);
    auVar82 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar282));
    auVar13 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar12));
    fVar143 = fVar100 * auVar82._0_4_ * 3.0;
    fVar157 = fVar100 * auVar82._4_4_ * 3.0;
    auVar39._4_4_ = fVar157;
    auVar39._0_4_ = fVar143;
    fVar158 = fVar100 * auVar82._8_4_ * 3.0;
    auVar39._8_4_ = fVar158;
    fVar159 = fVar100 * auVar82._12_4_ * 3.0;
    auVar39._12_4_ = fVar159;
    fVar160 = fVar100 * auVar82._16_4_ * 3.0;
    auVar39._16_4_ = fVar160;
    fVar161 = fVar100 * auVar82._20_4_ * 3.0;
    auVar39._20_4_ = fVar161;
    fVar253 = fVar100 * auVar82._24_4_ * 3.0;
    auVar39._24_4_ = fVar253;
    auVar39._28_4_ = 0x40400000;
    auVar204._0_4_ = fVar100 * auVar13._0_4_ * 3.0;
    auVar204._4_4_ = fVar100 * auVar13._4_4_ * 3.0;
    auVar204._8_4_ = fVar100 * auVar13._8_4_ * 3.0;
    auVar204._12_4_ = fVar100 * auVar13._12_4_ * 3.0;
    auVar204._16_4_ = fVar100 * auVar13._16_4_ * 3.0;
    auVar204._20_4_ = fVar100 * auVar13._20_4_ * 3.0;
    auVar204._24_4_ = fVar100 * auVar13._24_4_ * 3.0;
    auVar204._28_4_ = 0;
    auVar18 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar233));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar106));
    auVar82 = vsubps_avx(ZEXT1632(auVar233),ZEXT1632(auVar210));
    auVar13 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar20));
    auVar15 = vsubps_avx(auVar18,local_2c8);
    fVar265 = auVar82._0_4_ + auVar15._0_4_;
    fVar183 = auVar82._4_4_ + auVar15._4_4_;
    fVar186 = auVar82._8_4_ + auVar15._8_4_;
    fVar188 = auVar82._12_4_ + auVar15._12_4_;
    fVar189 = auVar82._16_4_ + auVar15._16_4_;
    fVar190 = auVar82._20_4_ + auVar15._20_4_;
    fVar191 = auVar82._24_4_ + auVar15._24_4_;
    auVar16 = vsubps_avx(local_78,auVar17);
    auVar278._0_4_ = auVar13._0_4_ + auVar16._0_4_;
    auVar278._4_4_ = auVar13._4_4_ + auVar16._4_4_;
    auVar278._8_4_ = auVar13._8_4_ + auVar16._8_4_;
    auVar278._12_4_ = auVar13._12_4_ + auVar16._12_4_;
    auVar278._16_4_ = auVar13._16_4_ + auVar16._16_4_;
    auVar278._20_4_ = auVar13._20_4_ + auVar16._20_4_;
    auVar278._24_4_ = auVar13._24_4_ + auVar16._24_4_;
    auVar278._28_4_ = auVar13._28_4_ + auVar16._28_4_;
    fVar100 = auVar20._0_4_;
    local_158 = fVar100 + (float)local_5e8._0_4_;
    fVar85 = auVar20._4_4_;
    fStack_154 = fVar85 + (float)local_5e8._4_4_;
    fVar144 = auVar20._8_4_;
    fStack_150 = fVar144 + fStack_5e0;
    fVar184 = auVar20._12_4_;
    fStack_14c = fVar184 + fStack_5dc;
    fStack_148 = fStack_5d8 + 0.0;
    fStack_144 = fStack_5d4 + 0.0;
    fStack_140 = fStack_5d0 + 0.0;
    fStack_13c = auVar14._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar210);
    auVar13 = vsubps_avx(local_98,auVar30);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    local_b8 = ZEXT1632(auVar20);
    auVar13 = vsubps_avx(local_b8,_local_5e8);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    local_f8._0_4_ = auVar233._0_4_ + fVar143;
    local_f8._4_4_ = auVar233._4_4_ + fVar157;
    local_f8._8_4_ = auVar233._8_4_ + fVar158;
    local_f8._12_4_ = auVar233._12_4_ + fVar159;
    local_f8._16_4_ = fVar160 + 0.0;
    local_f8._20_4_ = fVar161 + 0.0;
    local_f8._24_4_ = fVar253 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar97 = ZEXT1632(auVar233);
    auVar13 = vsubps_avx(auVar97,auVar39);
    auVar19 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    fVar143 = auVar106._0_4_;
    local_138._0_4_ = fVar143 + auVar204._0_4_;
    fVar157 = auVar106._4_4_;
    local_138._4_4_ = fVar157 + auVar204._4_4_;
    fVar158 = auVar106._8_4_;
    local_138._8_4_ = fVar158 + auVar204._8_4_;
    fVar159 = auVar106._12_4_;
    local_138._12_4_ = fVar159 + auVar204._12_4_;
    local_138._16_4_ = auVar204._16_4_ + 0.0;
    local_138._20_4_ = auVar204._20_4_ + 0.0;
    local_138._24_4_ = auVar204._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar13 = vsubps_avx(ZEXT1632(auVar106),auVar204);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    auVar40._4_4_ = fVar85 * fVar183;
    auVar40._0_4_ = fVar100 * fVar265;
    auVar40._8_4_ = fVar144 * fVar186;
    auVar40._12_4_ = fVar184 * fVar188;
    auVar40._16_4_ = fVar189 * 0.0;
    auVar40._20_4_ = fVar190 * 0.0;
    auVar40._24_4_ = fVar191 * 0.0;
    auVar40._28_4_ = auVar13._28_4_;
    auVar12 = vfnmadd231ps_fma(auVar40,local_98,auVar278);
    auVar41._4_4_ = fStack_154 * fVar183;
    auVar41._0_4_ = local_158 * fVar265;
    auVar41._8_4_ = fStack_150 * fVar186;
    auVar41._12_4_ = fStack_14c * fVar188;
    auVar41._16_4_ = fStack_148 * fVar189;
    auVar41._20_4_ = fStack_144 * fVar190;
    auVar41._24_4_ = fStack_140 * fVar191;
    auVar41._28_4_ = auVar19._28_4_;
    auVar54._4_4_ = fVar266;
    auVar54._0_4_ = fVar264;
    auVar54._8_4_ = fVar240;
    auVar54._12_4_ = fVar241;
    auVar54._16_4_ = fVar242;
    auVar54._20_4_ = fVar243;
    auVar54._24_4_ = fVar244;
    auVar54._28_4_ = 0x40400000;
    auVar81 = vfnmadd231ps_fma(auVar41,auVar278,auVar54);
    auVar42._4_4_ = local_178._4_4_ * fVar183;
    auVar42._0_4_ = local_178._0_4_ * fVar265;
    auVar42._8_4_ = local_178._8_4_ * fVar186;
    auVar42._12_4_ = local_178._12_4_ * fVar188;
    auVar42._16_4_ = local_178._16_4_ * fVar189;
    auVar42._20_4_ = local_178._20_4_ * fVar190;
    auVar42._24_4_ = local_178._24_4_ * fVar191;
    auVar42._28_4_ = fStack_13c;
    auVar282 = vfnmadd231ps_fma(auVar42,local_d8,auVar278);
    local_608._0_4_ = auVar17._0_4_;
    local_608._4_4_ = auVar17._4_4_;
    uStack_600._0_4_ = auVar17._8_4_;
    uStack_600._4_4_ = auVar17._12_4_;
    uStack_5f8._0_4_ = auVar17._16_4_;
    uStack_5f8._4_4_ = auVar17._20_4_;
    uStack_5f0._0_4_ = auVar17._24_4_;
    auVar43._4_4_ = fVar183 * (float)local_608._4_4_;
    auVar43._0_4_ = fVar265 * (float)local_608._0_4_;
    auVar43._8_4_ = fVar186 * (float)uStack_600;
    auVar43._12_4_ = fVar188 * uStack_600._4_4_;
    auVar43._16_4_ = fVar189 * (float)uStack_5f8;
    auVar43._20_4_ = fVar190 * uStack_5f8._4_4_;
    auVar43._24_4_ = fVar191 * (float)uStack_5f0;
    auVar43._28_4_ = local_178._28_4_;
    auVar6 = vfnmadd231ps_fma(auVar43,local_2c8,auVar278);
    auVar60._4_4_ = fVar157 * fVar183;
    auVar60._0_4_ = fVar143 * fVar265;
    auVar60._8_4_ = fVar158 * fVar186;
    auVar60._12_4_ = fVar159 * fVar188;
    auVar60._16_4_ = fVar189 * 0.0;
    auVar60._20_4_ = fVar190 * 0.0;
    auVar60._24_4_ = fVar191 * 0.0;
    auVar60._28_4_ = DAT_0205d4a0._28_4_;
    auVar233 = vfnmadd231ps_fma(auVar60,auVar97,auVar278);
    auVar44._4_4_ = local_138._4_4_ * fVar183;
    auVar44._0_4_ = local_138._0_4_ * fVar265;
    auVar44._8_4_ = local_138._8_4_ * fVar186;
    auVar44._12_4_ = local_138._12_4_ * fVar188;
    auVar44._16_4_ = local_138._16_4_ * fVar189;
    auVar44._20_4_ = local_138._20_4_ * fVar190;
    auVar44._24_4_ = local_138._24_4_ * fVar191;
    auVar44._28_4_ = local_2c8._28_4_;
    auVar76 = vfnmadd231ps_fma(auVar44,local_f8,auVar278);
    auVar45._4_4_ = local_118._4_4_ * fVar183;
    auVar45._0_4_ = local_118._0_4_ * fVar265;
    auVar45._8_4_ = local_118._8_4_ * fVar186;
    auVar45._12_4_ = local_118._12_4_ * fVar188;
    auVar45._16_4_ = local_118._16_4_ * fVar189;
    auVar45._20_4_ = local_118._20_4_ * fVar190;
    auVar45._24_4_ = local_118._24_4_ * fVar191;
    auVar45._28_4_ = local_d8._28_4_;
    auVar210 = vfnmadd231ps_fma(auVar45,auVar278,auVar19);
    auVar46._4_4_ = local_78._4_4_ * fVar183;
    auVar46._0_4_ = local_78._0_4_ * fVar265;
    auVar46._8_4_ = local_78._8_4_ * fVar186;
    auVar46._12_4_ = local_78._12_4_ * fVar188;
    auVar46._16_4_ = local_78._16_4_ * fVar189;
    auVar46._20_4_ = local_78._20_4_ * fVar190;
    auVar46._24_4_ = local_78._24_4_ * fVar191;
    auVar46._28_4_ = auVar82._28_4_ + auVar15._28_4_;
    auVar20 = vfnmadd231ps_fma(auVar46,auVar278,auVar18);
    auVar13 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar81));
    auVar82 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar81));
    auVar14 = vminps_avx(ZEXT1632(auVar282),ZEXT1632(auVar6));
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(ZEXT1632(auVar282),ZEXT1632(auVar6));
    auVar82 = vmaxps_avx(auVar82,auVar13);
    auVar15 = vminps_avx(ZEXT1632(auVar233),ZEXT1632(auVar76));
    auVar13 = vmaxps_avx(ZEXT1632(auVar233),ZEXT1632(auVar76));
    auVar16 = vminps_avx(ZEXT1632(auVar210),ZEXT1632(auVar20));
    auVar15 = vminps_avx(auVar15,auVar16);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar210),ZEXT1632(auVar20));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(auVar82,auVar13);
    auVar59._4_4_ = fStack_194;
    auVar59._0_4_ = local_198;
    auVar59._8_4_ = fStack_190;
    auVar59._12_4_ = fStack_18c;
    auVar59._16_4_ = fStack_188;
    auVar59._20_4_ = fStack_184;
    auVar59._24_4_ = fStack_180;
    auVar59._28_4_ = fStack_17c;
    auVar82 = vcmpps_avx(auVar15,auVar59,2);
    auVar58._4_4_ = fStack_1b4;
    auVar58._0_4_ = local_1b8;
    auVar58._8_4_ = fStack_1b0;
    auVar58._12_4_ = fStack_1ac;
    auVar58._16_4_ = fStack_1a8;
    auVar58._20_4_ = fStack_1a4;
    auVar58._24_4_ = fStack_1a0;
    auVar58._28_4_ = fStack_19c;
    auVar13 = vcmpps_avx(auVar13,auVar58,5);
    auVar82 = vandps_avx(auVar13,auVar82);
    auVar13 = local_2a8 & auVar82;
    uVar62 = 0;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar13 = vsubps_avx(local_2c8,local_98);
      auVar14 = vsubps_avx(auVar18,auVar97);
      fVar161 = auVar13._0_4_ + auVar14._0_4_;
      fVar253 = auVar13._4_4_ + auVar14._4_4_;
      fVar265 = auVar13._8_4_ + auVar14._8_4_;
      fVar183 = auVar13._12_4_ + auVar14._12_4_;
      fVar186 = auVar13._16_4_ + auVar14._16_4_;
      fVar188 = auVar13._20_4_ + auVar14._20_4_;
      fVar189 = auVar13._24_4_ + auVar14._24_4_;
      auVar15 = vsubps_avx(auVar17,local_b8);
      auVar16 = vsubps_avx(local_78,ZEXT1632(auVar106));
      auVar99._0_4_ = auVar15._0_4_ + auVar16._0_4_;
      auVar99._4_4_ = auVar15._4_4_ + auVar16._4_4_;
      auVar99._8_4_ = auVar15._8_4_ + auVar16._8_4_;
      auVar99._12_4_ = auVar15._12_4_ + auVar16._12_4_;
      auVar99._16_4_ = auVar15._16_4_ + auVar16._16_4_;
      auVar99._20_4_ = auVar15._20_4_ + auVar16._20_4_;
      auVar99._24_4_ = auVar15._24_4_ + auVar16._24_4_;
      fVar160 = auVar16._28_4_;
      auVar99._28_4_ = auVar15._28_4_ + fVar160;
      auVar286._0_4_ = fVar100 * fVar161;
      auVar286._4_4_ = fVar85 * fVar253;
      auVar286._8_4_ = fVar144 * fVar265;
      auVar286._12_4_ = fVar184 * fVar183;
      auVar286._16_4_ = fVar186 * 0.0;
      auVar286._20_4_ = fVar188 * 0.0;
      auVar286._24_4_ = fVar189 * 0.0;
      auVar286._28_4_ = 0;
      auVar233 = vfnmadd231ps_fma(auVar286,auVar99,local_98);
      auVar47._4_4_ = fVar253 * fStack_154;
      auVar47._0_4_ = fVar161 * local_158;
      auVar47._8_4_ = fVar265 * fStack_150;
      auVar47._12_4_ = fVar183 * fStack_14c;
      auVar47._16_4_ = fVar186 * fStack_148;
      auVar47._20_4_ = fVar188 * fStack_144;
      auVar47._24_4_ = fVar189 * fStack_140;
      auVar47._28_4_ = fVar160;
      auVar55._4_4_ = fVar266;
      auVar55._0_4_ = fVar264;
      auVar55._8_4_ = fVar240;
      auVar55._12_4_ = fVar241;
      auVar55._16_4_ = fVar242;
      auVar55._20_4_ = fVar243;
      auVar55._24_4_ = fVar244;
      auVar55._28_4_ = 0x40400000;
      auVar12 = vfnmadd213ps_fma(auVar55,auVar99,auVar47);
      auVar48._4_4_ = fVar253 * local_178._4_4_;
      auVar48._0_4_ = fVar161 * local_178._0_4_;
      auVar48._8_4_ = fVar265 * local_178._8_4_;
      auVar48._12_4_ = fVar183 * local_178._12_4_;
      auVar48._16_4_ = fVar186 * local_178._16_4_;
      auVar48._20_4_ = fVar188 * local_178._20_4_;
      auVar48._24_4_ = fVar189 * local_178._24_4_;
      auVar48._28_4_ = fVar160;
      auVar81 = vfnmadd213ps_fma(local_d8,auVar99,auVar48);
      auVar49._4_4_ = (float)local_608._4_4_ * fVar253;
      auVar49._0_4_ = (float)local_608._0_4_ * fVar161;
      auVar49._8_4_ = (float)uStack_600 * fVar265;
      auVar49._12_4_ = uStack_600._4_4_ * fVar183;
      auVar49._16_4_ = (float)uStack_5f8 * fVar186;
      auVar49._20_4_ = uStack_5f8._4_4_ * fVar188;
      auVar49._24_4_ = (float)uStack_5f0 * fVar189;
      auVar49._28_4_ = fVar160;
      auVar106 = vfnmadd231ps_fma(auVar49,auVar99,local_2c8);
      auVar116._0_4_ = fVar143 * fVar161;
      auVar116._4_4_ = fVar157 * fVar253;
      auVar116._8_4_ = fVar158 * fVar265;
      auVar116._12_4_ = fVar159 * fVar183;
      auVar116._16_4_ = fVar186 * 0.0;
      auVar116._20_4_ = fVar188 * 0.0;
      auVar116._24_4_ = fVar189 * 0.0;
      auVar116._28_4_ = 0;
      auVar76 = vfnmadd231ps_fma(auVar116,auVar99,auVar97);
      auVar50._4_4_ = fVar253 * local_138._4_4_;
      auVar50._0_4_ = fVar161 * local_138._0_4_;
      auVar50._8_4_ = fVar265 * local_138._8_4_;
      auVar50._12_4_ = fVar183 * local_138._12_4_;
      auVar50._16_4_ = fVar186 * local_138._16_4_;
      auVar50._20_4_ = fVar188 * local_138._20_4_;
      auVar50._24_4_ = fVar189 * local_138._24_4_;
      auVar50._28_4_ = auVar17._28_4_;
      auVar282 = vfnmadd213ps_fma(local_f8,auVar99,auVar50);
      auVar51._4_4_ = fVar253 * local_118._4_4_;
      auVar51._0_4_ = fVar161 * local_118._0_4_;
      auVar51._8_4_ = fVar265 * local_118._8_4_;
      auVar51._12_4_ = fVar183 * local_118._12_4_;
      auVar51._16_4_ = fVar186 * local_118._16_4_;
      auVar51._20_4_ = fVar188 * local_118._20_4_;
      auVar51._24_4_ = fVar189 * local_118._24_4_;
      auVar51._28_4_ = auVar17._28_4_;
      auVar6 = vfnmadd213ps_fma(auVar19,auVar99,auVar51);
      auVar52._4_4_ = local_78._4_4_ * fVar253;
      auVar52._0_4_ = local_78._0_4_ * fVar161;
      auVar52._8_4_ = local_78._8_4_ * fVar265;
      auVar52._12_4_ = local_78._12_4_ * fVar183;
      auVar52._16_4_ = local_78._16_4_ * fVar186;
      auVar52._20_4_ = local_78._20_4_ * fVar188;
      auVar52._24_4_ = local_78._24_4_ * fVar189;
      auVar52._28_4_ = auVar13._28_4_ + auVar14._28_4_;
      auVar210 = vfnmadd231ps_fma(auVar52,auVar99,auVar18);
      auVar14 = vminps_avx(ZEXT1632(auVar233),ZEXT1632(auVar12));
      auVar13 = vmaxps_avx(ZEXT1632(auVar233),ZEXT1632(auVar12));
      auVar15 = vminps_avx(ZEXT1632(auVar81),ZEXT1632(auVar106));
      auVar15 = vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(ZEXT1632(auVar81),ZEXT1632(auVar106));
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar16 = vminps_avx(ZEXT1632(auVar76),ZEXT1632(auVar282));
      auVar14 = vmaxps_avx(ZEXT1632(auVar76),ZEXT1632(auVar282));
      auVar17 = vminps_avx(ZEXT1632(auVar6),ZEXT1632(auVar210));
      auVar16 = vminps_avx(auVar16,auVar17);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(ZEXT1632(auVar6),ZEXT1632(auVar210));
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vcmpps_avx(auVar16,auVar59,2);
      auVar14 = vcmpps_avx(auVar14,auVar58,5);
      auVar13 = vandps_avx(auVar14,auVar13);
      auVar82 = vandps_avx(auVar82,local_2a8);
      auVar14 = auVar82 & auVar13;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar82 = vandps_avx(auVar13,auVar82);
        uVar62 = vmovmskps_avx(auVar82);
      }
    }
    if (uVar62 != 0) {
      auStack_418[uVar65] = uVar62;
      uVar163 = vmovlps_avx(local_378);
      *(undefined8 *)(&uStack_288 + uVar65 * 2) = uVar163;
      uVar70 = vmovlps_avx(local_668);
      auStack_58[uVar65] = uVar70;
      uVar65 = (ulong)((int)uVar65 + 1);
    }
    do {
      if ((int)uVar65 == 0) {
        if (bVar71) {
          return local_669;
        }
        uVar75 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar83._4_4_ = uVar75;
        auVar83._0_4_ = uVar75;
        auVar83._8_4_ = uVar75;
        auVar83._12_4_ = uVar75;
        auVar83._16_4_ = uVar75;
        auVar83._20_4_ = uVar75;
        auVar83._24_4_ = uVar75;
        auVar83._28_4_ = uVar75;
        auVar82 = vcmpps_avx(local_1d8,auVar83,2);
        uVar61 = vmovmskps_avx(auVar82);
        uVar61 = (uint)uVar72 & uVar61;
        local_669 = uVar61 != 0;
        if (!local_669) {
          return local_669;
        }
        goto LAB_018b610e;
      }
      uVar63 = (int)uVar65 - 1;
      uVar66 = (ulong)uVar63;
      uVar69 = auStack_418[uVar66];
      uVar62 = (&uStack_288)[uVar66 * 2];
      fVar143 = afStack_284[uVar66 * 2];
      iVar64 = 0;
      for (uVar70 = (ulong)uVar69; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
        iVar64 = iVar64 + 1;
      }
      uVar69 = uVar69 - 1 & uVar69;
      if (uVar69 == 0) {
        uVar65 = (ulong)uVar63;
      }
      local_668._8_8_ = 0;
      local_668._0_8_ = auStack_58[uVar66];
      auStack_418[uVar66] = uVar69;
      fVar157 = (float)(iVar64 + 1) * 0.14285715;
      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar143 * (float)iVar64 * 0.14285715)),
                                ZEXT416(uVar62),ZEXT416((uint)(1.0 - (float)iVar64 * 0.14285715)));
      auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar143 * fVar157)),ZEXT416(uVar62),
                                ZEXT416((uint)(1.0 - fVar157)));
      auVar181._0_4_ = auVar12._0_4_;
      fVar157 = auVar81._0_4_;
      fVar143 = fVar157 - auVar181._0_4_;
      if (0.16666667 <= fVar143) break;
      auVar282 = vshufps_avx(local_668,local_668,0x50);
      auVar103._8_4_ = 0x3f800000;
      auVar103._0_8_ = &DAT_3f8000003f800000;
      auVar103._12_4_ = 0x3f800000;
      auVar6 = vsubps_avx(auVar103,auVar282);
      fVar158 = auVar282._0_4_;
      auVar121._0_4_ = fVar158 * (float)local_468._0_4_;
      fVar159 = auVar282._4_4_;
      auVar121._4_4_ = fVar159 * (float)local_468._4_4_;
      fVar100 = auVar282._8_4_;
      auVar121._8_4_ = fVar100 * fStack_460;
      fVar85 = auVar282._12_4_;
      auVar121._12_4_ = fVar85 * fStack_45c;
      auVar131._0_4_ = fVar158 * (float)local_478._0_4_;
      auVar131._4_4_ = fVar159 * (float)local_478._4_4_;
      auVar131._8_4_ = fVar100 * fStack_470;
      auVar131._12_4_ = fVar85 * fStack_46c;
      auVar149._0_4_ = fVar158 * (float)local_488._0_4_;
      auVar149._4_4_ = fVar159 * (float)local_488._4_4_;
      auVar149._8_4_ = fVar100 * fStack_480;
      auVar149._12_4_ = fVar85 * fStack_47c;
      auVar90._0_4_ = fVar158 * (float)local_498._0_4_;
      auVar90._4_4_ = fVar159 * (float)local_498._4_4_;
      auVar90._8_4_ = fVar100 * fStack_490;
      auVar90._12_4_ = fVar85 * fStack_48c;
      auVar282 = vfmadd231ps_fma(auVar121,auVar6,local_428);
      auVar233 = vfmadd231ps_fma(auVar131,auVar6,local_438);
      auVar106 = vfmadd231ps_fma(auVar149,auVar6,local_448);
      auVar6 = vfmadd231ps_fma(auVar90,auVar6,local_458);
      auVar117._16_16_ = auVar282;
      auVar117._0_16_ = auVar282;
      auVar128._16_16_ = auVar233;
      auVar128._0_16_ = auVar233;
      auVar142._16_16_ = auVar106;
      auVar142._0_16_ = auVar106;
      auVar181._4_4_ = auVar181._0_4_;
      auVar181._8_4_ = auVar181._0_4_;
      auVar181._12_4_ = auVar181._0_4_;
      auVar181._20_4_ = fVar157;
      auVar181._16_4_ = fVar157;
      auVar181._24_4_ = fVar157;
      auVar181._28_4_ = fVar157;
      auVar82 = vsubps_avx(auVar128,auVar117);
      auVar233 = vfmadd213ps_fma(auVar82,auVar181,auVar117);
      auVar82 = vsubps_avx(auVar142,auVar128);
      auVar76 = vfmadd213ps_fma(auVar82,auVar181,auVar128);
      auVar282 = vsubps_avx(auVar6,auVar106);
      auVar129._16_16_ = auVar282;
      auVar129._0_16_ = auVar282;
      auVar282 = vfmadd213ps_fma(auVar129,auVar181,auVar142);
      auVar82 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar233));
      auVar6 = vfmadd213ps_fma(auVar82,auVar181,ZEXT1632(auVar233));
      auVar82 = vsubps_avx(ZEXT1632(auVar282),ZEXT1632(auVar76));
      auVar282 = vfmadd213ps_fma(auVar82,auVar181,ZEXT1632(auVar76));
      auVar82 = vsubps_avx(ZEXT1632(auVar282),ZEXT1632(auVar6));
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar82,auVar181);
      fVar184 = auVar82._4_4_ * 3.0;
      fVar144 = fVar143 * 0.33333334;
      local_2c8._0_8_ =
           CONCAT44(auVar21._4_4_ + fVar144 * fVar184,auVar21._0_4_ + fVar144 * auVar82._0_4_ * 3.0)
      ;
      local_2c8._8_4_ = auVar21._8_4_ + fVar144 * auVar82._8_4_ * 3.0;
      local_2c8._12_4_ = auVar21._12_4_ + fVar144 * auVar82._12_4_ * 3.0;
      auVar6 = vshufpd_avx(auVar21,auVar21,3);
      auVar233 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar282 = vsubps_avx(auVar6,auVar21);
      auVar106 = vsubps_avx(auVar233,(undefined1  [16])0x0);
      auVar104._0_4_ = auVar282._0_4_ + auVar106._0_4_;
      auVar104._4_4_ = auVar282._4_4_ + auVar106._4_4_;
      auVar104._8_4_ = auVar282._8_4_ + auVar106._8_4_;
      auVar104._12_4_ = auVar282._12_4_ + auVar106._12_4_;
      auVar282 = vshufps_avx(auVar21,auVar21,0xb1);
      auVar106 = vshufps_avx(local_2c8._0_16_,local_2c8._0_16_,0xb1);
      auVar268._4_4_ = auVar104._0_4_;
      auVar268._0_4_ = auVar104._0_4_;
      auVar268._8_4_ = auVar104._0_4_;
      auVar268._12_4_ = auVar104._0_4_;
      auVar76 = vshufps_avx(auVar104,auVar104,0x55);
      fVar158 = auVar76._0_4_;
      auVar195._0_4_ = auVar282._0_4_ * fVar158;
      fVar159 = auVar76._4_4_;
      auVar195._4_4_ = auVar282._4_4_ * fVar159;
      fVar100 = auVar76._8_4_;
      auVar195._8_4_ = auVar282._8_4_ * fVar100;
      fVar85 = auVar76._12_4_;
      auVar195._12_4_ = auVar282._12_4_ * fVar85;
      auVar208._0_4_ = auVar106._0_4_ * fVar158;
      auVar208._4_4_ = auVar106._4_4_ * fVar159;
      auVar208._8_4_ = auVar106._8_4_ * fVar100;
      auVar208._12_4_ = auVar106._12_4_ * fVar85;
      auVar210 = vfmadd231ps_fma(auVar195,auVar268,auVar21);
      auVar20 = vfmadd231ps_fma(auVar208,auVar268,local_2c8._0_16_);
      auVar106 = vshufps_avx(auVar210,auVar210,0xe8);
      auVar76 = vshufps_avx(auVar20,auVar20,0xe8);
      auVar282 = vcmpps_avx(auVar106,auVar76,1);
      uVar62 = vextractps_avx(auVar282,0);
      auVar86 = auVar20;
      if ((uVar62 & 1) == 0) {
        auVar86 = auVar210;
      }
      auVar132._0_4_ = fVar144 * auVar82._16_4_ * 3.0;
      auVar132._4_4_ = fVar144 * fVar184;
      auVar132._8_4_ = fVar144 * auVar82._24_4_ * 3.0;
      auVar132._12_4_ = fVar144 * fVar157;
      auVar87 = vsubps_avx((undefined1  [16])0x0,auVar132);
      auVar133 = vshufps_avx(auVar87,auVar87,0xb1);
      auVar77 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar289._0_4_ = auVar133._0_4_ * fVar158;
      auVar289._4_4_ = auVar133._4_4_ * fVar159;
      auVar289._8_4_ = auVar133._8_4_ * fVar100;
      auVar289._12_4_ = auVar133._12_4_ * fVar85;
      auVar105._0_4_ = auVar77._0_4_ * fVar158;
      auVar105._4_4_ = auVar77._4_4_ * fVar159;
      auVar105._8_4_ = auVar77._8_4_ * fVar100;
      auVar105._12_4_ = auVar77._12_4_ * fVar85;
      auVar88 = vfmadd231ps_fma(auVar289,auVar268,auVar87);
      auVar89 = vfmadd231ps_fma(auVar105,(undefined1  [16])0x0,auVar268);
      auVar77 = vshufps_avx(auVar88,auVar88,0xe8);
      auVar78 = vshufps_avx(auVar89,auVar89,0xe8);
      auVar133 = vcmpps_avx(auVar77,auVar78,1);
      uVar62 = vextractps_avx(auVar133,0);
      auVar101 = auVar89;
      if ((uVar62 & 1) == 0) {
        auVar101 = auVar88;
      }
      auVar86 = vmaxss_avx(auVar101,auVar86);
      auVar106 = vminps_avx(auVar106,auVar76);
      auVar76 = vminps_avx(auVar77,auVar78);
      auVar76 = vminps_avx(auVar106,auVar76);
      auVar282 = vshufps_avx(auVar282,auVar282,0x55);
      auVar282 = vblendps_avx(auVar282,auVar133,2);
      auVar133 = vpslld_avx(auVar282,0x1f);
      auVar282 = vshufpd_avx(auVar20,auVar20,1);
      auVar282 = vinsertps_avx(auVar282,auVar89,0x9c);
      auVar106 = vshufpd_avx(auVar210,auVar210,1);
      auVar106 = vinsertps_avx(auVar106,auVar88,0x9c);
      auVar282 = vblendvps_avx(auVar106,auVar282,auVar133);
      auVar106 = vmovshdup_avx(auVar282);
      auVar282 = vmaxss_avx(auVar106,auVar282);
      fVar100 = auVar76._0_4_;
      auVar106 = vmovshdup_avx(auVar76);
      fVar159 = auVar282._0_4_;
      fVar158 = auVar86._0_4_;
      if ((0.0001 <= fVar100) || (fVar159 <= -0.0001)) {
        auVar210 = vcmpps_avx(auVar106,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar20 = vcmpps_avx(auVar76,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar210 = vorps_avx(auVar20,auVar210);
        if ((-0.0001 < fVar158 & auVar210[0]) != 0) goto LAB_018b71a9;
        auVar210 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar282,5);
        auVar20 = vcmpps_avx(auVar106,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar210 = vorps_avx(auVar20,auVar210);
        if ((auVar210 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_018b71a9;
LAB_018b7ccb:
        bVar53 = true;
      }
      else {
LAB_018b71a9:
        auVar20 = vcmpps_avx(auVar76,_DAT_01feba10,1);
        auVar133 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar210 = vcmpss_avx(auVar86,ZEXT816(0) << 0x20,1);
        auVar150._8_4_ = 0x3f800000;
        auVar150._0_8_ = &DAT_3f8000003f800000;
        auVar150._12_4_ = 0x3f800000;
        auVar209._8_4_ = 0xbf800000;
        auVar209._0_8_ = 0xbf800000bf800000;
        auVar209._12_4_ = 0xbf800000;
        auVar210 = vblendvps_avx(auVar150,auVar209,auVar210);
        auVar20 = vblendvps_avx(auVar150,auVar209,auVar20);
        fVar85 = auVar20._0_4_;
        fVar144 = auVar210._0_4_;
        auVar210 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar77 = ZEXT816(0) << 0x20;
        if ((fVar85 == fVar144) && (!NAN(fVar85) && !NAN(fVar144))) {
          auVar210 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar85 == fVar144) && (!NAN(fVar85) && !NAN(fVar144))) {
          auVar133 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar20 = vmovshdup_avx(auVar20);
        fVar184 = auVar20._0_4_;
        if ((fVar85 != fVar184) || (NAN(fVar85) || NAN(fVar184))) {
          fVar85 = auVar106._0_4_;
          if ((fVar85 != fVar100) || (NAN(fVar85) || NAN(fVar100))) {
            auVar107._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
            auVar107._8_4_ = auVar76._8_4_ ^ 0x80000000;
            auVar107._12_4_ = auVar76._12_4_ ^ 0x80000000;
            auVar134._0_4_ = -fVar100 / (fVar85 - fVar100);
            auVar134._4_12_ = auVar107._4_12_;
            auVar106 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar134._0_4_)),auVar77,auVar134);
            auVar76 = auVar106;
          }
          else {
            auVar106 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar100 == 0.0) && (auVar106 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar100))) {
              auVar106 = ZEXT816(0);
            }
            auVar76 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar100 == 0.0) && (auVar76 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar100))) {
              auVar76 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar210 = vminss_avx(auVar210,auVar106);
          auVar133 = vmaxss_avx(auVar76,auVar133);
        }
        auVar282 = vcmpss_avx(auVar282,auVar77,1);
        auVar135._8_4_ = 0x3f800000;
        auVar135._0_8_ = &DAT_3f8000003f800000;
        auVar135._12_4_ = 0x3f800000;
        auVar151._8_4_ = 0xbf800000;
        auVar151._0_8_ = 0xbf800000bf800000;
        auVar151._12_4_ = 0xbf800000;
        auVar282 = vblendvps_avx(auVar135,auVar151,auVar282);
        fVar100 = auVar282._0_4_;
        auVar282 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar144 != fVar100) || (NAN(fVar144) || NAN(fVar100))) {
          if ((fVar159 != fVar158) || (NAN(fVar159) || NAN(fVar158))) {
            auVar108._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
            auVar108._8_4_ = auVar86._8_4_ ^ 0x80000000;
            auVar108._12_4_ = auVar86._12_4_ ^ 0x80000000;
            auVar136._0_4_ = -fVar158 / (fVar159 - fVar158);
            auVar136._4_12_ = auVar108._4_12_;
            auVar106 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar136._0_4_)),auVar77,auVar136);
            auVar76 = auVar106;
          }
          else {
            auVar106 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar158 == 0.0) && (auVar106 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar158))) {
              auVar106 = ZEXT816(0);
            }
            auVar76 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar158 == 0.0) && (auVar76 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar158))) {
              auVar76 = auVar282;
            }
          }
          auVar210 = vminss_avx(auVar210,auVar106);
          auVar133 = vmaxss_avx(auVar76,auVar133);
        }
        if ((fVar184 != fVar100) || (NAN(fVar184) || NAN(fVar100))) {
          auVar210 = vminss_avx(auVar210,auVar282);
          auVar133 = vmaxss_avx(auVar282,auVar133);
        }
        auVar106 = vmaxss_avx(auVar77,auVar210);
        auVar76 = vminss_avx(auVar133,auVar282);
        bVar53 = true;
        if (auVar106._0_4_ <= auVar76._0_4_) {
          auVar106 = vmaxss_avx(auVar77,ZEXT416((uint)(auVar106._0_4_ + -0.1)));
          auVar282 = vminss_avx(ZEXT416((uint)(auVar76._0_4_ + 0.1)),auVar282);
          auVar91._0_8_ = auVar21._0_8_;
          auVar91._8_8_ = auVar91._0_8_;
          auVar211._8_8_ = local_2c8._0_8_;
          auVar211._0_8_ = local_2c8._0_8_;
          auVar226._8_8_ = auVar87._0_8_;
          auVar226._0_8_ = auVar87._0_8_;
          auVar76 = vshufpd_avx(local_2c8._0_16_,local_2c8._0_16_,3);
          auVar210 = vshufpd_avx(auVar87,auVar87,3);
          auVar20 = vshufps_avx(auVar106,auVar282,0);
          auVar122._8_4_ = 0x3f800000;
          auVar122._0_8_ = &DAT_3f8000003f800000;
          auVar122._12_4_ = 0x3f800000;
          auVar21 = vsubps_avx(auVar122,auVar20);
          local_5e8._0_4_ = auVar6._0_4_;
          local_5e8._4_4_ = auVar6._4_4_;
          fStack_5e0 = auVar6._8_4_;
          fStack_5dc = auVar6._12_4_;
          fVar158 = auVar20._0_4_;
          auVar123._0_4_ = fVar158 * (float)local_5e8._0_4_;
          fVar159 = auVar20._4_4_;
          auVar123._4_4_ = fVar159 * (float)local_5e8._4_4_;
          fVar100 = auVar20._8_4_;
          auVar123._8_4_ = fVar100 * fStack_5e0;
          fVar85 = auVar20._12_4_;
          auVar123._12_4_ = fVar85 * fStack_5dc;
          auVar137._0_4_ = auVar76._0_4_ * fVar158;
          auVar137._4_4_ = auVar76._4_4_ * fVar159;
          auVar137._8_4_ = auVar76._8_4_ * fVar100;
          auVar137._12_4_ = auVar76._12_4_ * fVar85;
          auVar152._0_4_ = auVar210._0_4_ * fVar158;
          auVar152._4_4_ = auVar210._4_4_ * fVar159;
          auVar152._8_4_ = auVar210._8_4_ * fVar100;
          auVar152._12_4_ = auVar210._12_4_ * fVar85;
          local_608._0_4_ = auVar233._0_4_;
          local_608._4_4_ = auVar233._4_4_;
          uStack_600._0_4_ = auVar233._8_4_;
          uStack_600._4_4_ = auVar233._12_4_;
          auVar175._0_4_ = fVar158 * (float)local_608._0_4_;
          auVar175._4_4_ = fVar159 * (float)local_608._4_4_;
          auVar175._8_4_ = fVar100 * (float)uStack_600;
          auVar175._12_4_ = fVar85 * uStack_600._4_4_;
          auVar76 = vfmadd231ps_fma(auVar123,auVar21,auVar91);
          auVar210 = vfmadd231ps_fma(auVar137,auVar21,auVar211);
          auVar20 = vfmadd231ps_fma(auVar152,auVar21,auVar226);
          auVar21 = vfmadd231ps_fma(auVar175,auVar21,ZEXT816(0));
          auVar6 = vmovshdup_avx(local_668);
          auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * auVar106._0_4_)),local_668,
                                    ZEXT416((uint)(1.0 - auVar106._0_4_)));
          auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * auVar282._0_4_)),local_668,
                                    ZEXT416((uint)(1.0 - auVar282._0_4_)));
          fVar158 = 1.0 / fVar143;
          auVar282 = vsubps_avx(auVar210,auVar76);
          auVar196._0_4_ = auVar282._0_4_ * 3.0;
          auVar196._4_4_ = auVar282._4_4_ * 3.0;
          auVar196._8_4_ = auVar282._8_4_ * 3.0;
          auVar196._12_4_ = auVar282._12_4_ * 3.0;
          auVar282 = vsubps_avx(auVar20,auVar210);
          auVar212._0_4_ = auVar282._0_4_ * 3.0;
          auVar212._4_4_ = auVar282._4_4_ * 3.0;
          auVar212._8_4_ = auVar282._8_4_ * 3.0;
          auVar212._12_4_ = auVar282._12_4_ * 3.0;
          auVar282 = vsubps_avx(auVar21,auVar20);
          auVar227._0_4_ = auVar282._0_4_ * 3.0;
          auVar227._4_4_ = auVar282._4_4_ * 3.0;
          auVar227._8_4_ = auVar282._8_4_ * 3.0;
          auVar227._12_4_ = auVar282._12_4_ * 3.0;
          auVar6 = vminps_avx(auVar212,auVar227);
          auVar282 = vmaxps_avx(auVar212,auVar227);
          auVar6 = vminps_avx(auVar196,auVar6);
          auVar282 = vmaxps_avx(auVar196,auVar282);
          auVar233 = vshufpd_avx(auVar6,auVar6,3);
          auVar106 = vshufpd_avx(auVar282,auVar282,3);
          auVar6 = vminps_avx(auVar6,auVar233);
          auVar282 = vmaxps_avx(auVar282,auVar106);
          auVar213._0_4_ = auVar6._0_4_ * fVar158;
          auVar213._4_4_ = auVar6._4_4_ * fVar158;
          auVar213._8_4_ = auVar6._8_4_ * fVar158;
          auVar213._12_4_ = auVar6._12_4_ * fVar158;
          auVar197._0_4_ = fVar158 * auVar282._0_4_;
          auVar197._4_4_ = fVar158 * auVar282._4_4_;
          auVar197._8_4_ = fVar158 * auVar282._8_4_;
          auVar197._12_4_ = fVar158 * auVar282._12_4_;
          fVar158 = 1.0 / (auVar78._0_4_ - auVar77._0_4_);
          auVar282 = vshufpd_avx(auVar76,auVar76,3);
          auVar6 = vshufpd_avx(auVar210,auVar210,3);
          auVar233 = vshufpd_avx(auVar20,auVar20,3);
          auVar106 = vshufpd_avx(auVar21,auVar21,3);
          auVar282 = vsubps_avx(auVar282,auVar76);
          auVar76 = vsubps_avx(auVar6,auVar210);
          auVar210 = vsubps_avx(auVar233,auVar20);
          auVar106 = vsubps_avx(auVar106,auVar21);
          auVar6 = vminps_avx(auVar282,auVar76);
          auVar282 = vmaxps_avx(auVar282,auVar76);
          auVar233 = vminps_avx(auVar210,auVar106);
          auVar233 = vminps_avx(auVar6,auVar233);
          auVar6 = vmaxps_avx(auVar210,auVar106);
          auVar282 = vmaxps_avx(auVar282,auVar6);
          auVar246._0_4_ = fVar158 * auVar233._0_4_;
          auVar246._4_4_ = fVar158 * auVar233._4_4_;
          auVar246._8_4_ = fVar158 * auVar233._8_4_;
          auVar246._12_4_ = fVar158 * auVar233._12_4_;
          auVar234._0_4_ = fVar158 * auVar282._0_4_;
          auVar234._4_4_ = fVar158 * auVar282._4_4_;
          auVar234._8_4_ = fVar158 * auVar282._8_4_;
          auVar234._12_4_ = fVar158 * auVar282._12_4_;
          auVar106 = vinsertps_avx(auVar12,auVar77,0x10);
          auVar76 = vinsertps_avx(auVar81,auVar78,0x10);
          auVar80._0_4_ = (auVar106._0_4_ + auVar76._0_4_) * 0.5;
          auVar80._4_4_ = (auVar106._4_4_ + auVar76._4_4_) * 0.5;
          auVar80._8_4_ = (auVar106._8_4_ + auVar76._8_4_) * 0.5;
          auVar80._12_4_ = (auVar106._12_4_ + auVar76._12_4_) * 0.5;
          auVar124._4_4_ = auVar80._0_4_;
          auVar124._0_4_ = auVar80._0_4_;
          auVar124._8_4_ = auVar80._0_4_;
          auVar124._12_4_ = auVar80._0_4_;
          auVar282 = vfmadd213ps_fma(local_2d8,auVar124,auVar3);
          auVar6 = vfmadd213ps_fma(local_2e8,auVar124,auVar4);
          auVar233 = vfmadd213ps_fma(local_2f8,auVar124,auVar5);
          auVar81 = vsubps_avx(auVar6,auVar282);
          auVar282 = vfmadd213ps_fma(auVar81,auVar124,auVar282);
          auVar81 = vsubps_avx(auVar233,auVar6);
          auVar81 = vfmadd213ps_fma(auVar81,auVar124,auVar6);
          auVar81 = vsubps_avx(auVar81,auVar282);
          auVar282 = vfmadd231ps_fma(auVar282,auVar81,auVar124);
          auVar125._0_8_ = CONCAT44(auVar81._4_4_ * 3.0,auVar81._0_4_ * 3.0);
          auVar125._8_4_ = auVar81._8_4_ * 3.0;
          auVar125._12_4_ = auVar81._12_4_ * 3.0;
          auVar228._8_8_ = auVar282._0_8_;
          auVar228._0_8_ = auVar282._0_8_;
          auVar81 = vshufpd_avx(auVar282,auVar282,3);
          auVar282 = vshufps_avx(auVar80,auVar80,0x55);
          auVar210 = vsubps_avx(auVar81,auVar228);
          auVar21 = vfmadd231ps_fma(auVar228,auVar282,auVar210);
          auVar269._8_8_ = auVar125._0_8_;
          auVar269._0_8_ = auVar125._0_8_;
          auVar81 = vshufpd_avx(auVar125,auVar125,3);
          auVar81 = vsubps_avx(auVar81,auVar269);
          auVar20 = vfmadd213ps_fma(auVar81,auVar282,auVar269);
          auVar282 = vmovshdup_avx(auVar20);
          auVar270._0_8_ = auVar282._0_8_ ^ 0x8000000080000000;
          auVar270._8_4_ = auVar282._8_4_ ^ 0x80000000;
          auVar270._12_4_ = auVar282._12_4_ ^ 0x80000000;
          auVar6 = vmovshdup_avx(auVar210);
          auVar81 = vunpcklps_avx(auVar6,auVar270);
          auVar233 = vshufps_avx(auVar81,auVar270,4);
          auVar290._0_8_ = auVar210._0_8_ ^ 0x8000000080000000;
          auVar290._8_4_ = auVar210._8_4_ ^ 0x80000000;
          auVar290._12_4_ = auVar210._12_4_ ^ 0x80000000;
          auVar81 = vmovlhps_avx(auVar290,auVar20);
          auVar81 = vshufps_avx(auVar81,auVar20,8);
          auVar282 = vfmsub231ss_fma(ZEXT416((uint)(auVar282._0_4_ * auVar210._0_4_)),auVar6,auVar20
                                    );
          auVar138._0_4_ = auVar282._0_4_;
          auVar138._4_4_ = auVar138._0_4_;
          auVar138._8_4_ = auVar138._0_4_;
          auVar138._12_4_ = auVar138._0_4_;
          auVar282 = vdivps_avx(auVar233,auVar138);
          auVar6 = vdivps_avx(auVar81,auVar138);
          fVar100 = auVar21._0_4_;
          fVar158 = auVar282._0_4_;
          auVar81 = vshufps_avx(auVar21,auVar21,0x55);
          fVar159 = auVar6._0_4_;
          local_608._4_4_ = fVar100 * auVar282._4_4_ + auVar81._4_4_ * auVar6._4_4_;
          local_608._0_4_ = fVar100 * fVar158 + auVar81._0_4_ * fVar159;
          uStack_600._0_4_ = fVar100 * auVar282._8_4_ + auVar81._8_4_ * auVar6._8_4_;
          uStack_600._4_4_ = fVar100 * auVar282._12_4_ + auVar81._12_4_ * auVar6._12_4_;
          auVar210 = vmovshdup_avx(auVar282);
          auVar81 = vinsertps_avx(auVar213,auVar246,0x1c);
          auVar283._0_4_ = auVar210._0_4_ * auVar81._0_4_;
          auVar283._4_4_ = auVar210._4_4_ * auVar81._4_4_;
          auVar283._8_4_ = auVar210._8_4_ * auVar81._8_4_;
          auVar283._12_4_ = auVar210._12_4_ * auVar81._12_4_;
          auVar233 = vinsertps_avx(auVar197,auVar234,0x1c);
          auVar256._0_4_ = auVar210._0_4_ * auVar233._0_4_;
          auVar256._4_4_ = auVar210._4_4_ * auVar233._4_4_;
          auVar256._8_4_ = auVar210._8_4_ * auVar233._8_4_;
          auVar256._12_4_ = auVar210._12_4_ * auVar233._12_4_;
          auVar86 = vminps_avx(auVar283,auVar256);
          auVar21 = vmaxps_avx(auVar256,auVar283);
          auVar210 = vinsertps_avx(auVar246,auVar213,0x4c);
          auVar133 = vmovshdup_avx(auVar6);
          auVar20 = vinsertps_avx(auVar234,auVar197,0x4c);
          auVar235._0_4_ = auVar133._0_4_ * auVar210._0_4_;
          auVar235._4_4_ = auVar133._4_4_ * auVar210._4_4_;
          auVar235._8_4_ = auVar133._8_4_ * auVar210._8_4_;
          auVar235._12_4_ = auVar133._12_4_ * auVar210._12_4_;
          auVar247._0_4_ = auVar133._0_4_ * auVar20._0_4_;
          auVar247._4_4_ = auVar133._4_4_ * auVar20._4_4_;
          auVar247._8_4_ = auVar133._8_4_ * auVar20._8_4_;
          auVar247._12_4_ = auVar133._12_4_ * auVar20._12_4_;
          auVar133 = vminps_avx(auVar235,auVar247);
          auVar92._0_4_ = auVar133._0_4_ + auVar86._0_4_;
          auVar92._4_4_ = auVar133._4_4_ + auVar86._4_4_;
          auVar92._8_4_ = auVar133._8_4_ + auVar86._8_4_;
          auVar92._12_4_ = auVar133._12_4_ + auVar86._12_4_;
          auVar86 = vmaxps_avx(auVar247,auVar235);
          auVar236._0_4_ = auVar21._0_4_ + auVar86._0_4_;
          auVar236._4_4_ = auVar21._4_4_ + auVar86._4_4_;
          auVar236._8_4_ = auVar21._8_4_ + auVar86._8_4_;
          auVar236._12_4_ = auVar21._12_4_ + auVar86._12_4_;
          auVar248._8_8_ = 0x3f80000000000000;
          auVar248._0_8_ = 0x3f80000000000000;
          auVar21 = vsubps_avx(auVar248,auVar236);
          auVar86 = vsubps_avx(auVar248,auVar92);
          auVar133 = vsubps_avx(auVar106,auVar80);
          auVar271._0_4_ = fVar158 * auVar81._0_4_;
          auVar271._4_4_ = fVar158 * auVar81._4_4_;
          auVar271._8_4_ = fVar158 * auVar81._8_4_;
          auVar271._12_4_ = fVar158 * auVar81._12_4_;
          auVar257._0_4_ = fVar158 * auVar233._0_4_;
          auVar257._4_4_ = fVar158 * auVar233._4_4_;
          auVar257._8_4_ = fVar158 * auVar233._8_4_;
          auVar257._12_4_ = fVar158 * auVar233._12_4_;
          auVar233 = vminps_avx(auVar271,auVar257);
          auVar81 = vmaxps_avx(auVar257,auVar271);
          auVar214._0_4_ = fVar159 * auVar210._0_4_;
          auVar214._4_4_ = fVar159 * auVar210._4_4_;
          auVar214._8_4_ = fVar159 * auVar210._8_4_;
          auVar214._12_4_ = fVar159 * auVar210._12_4_;
          auVar198._0_4_ = fVar159 * auVar20._0_4_;
          auVar198._4_4_ = fVar159 * auVar20._4_4_;
          auVar198._8_4_ = fVar159 * auVar20._8_4_;
          auVar198._12_4_ = fVar159 * auVar20._12_4_;
          auVar210 = vminps_avx(auVar214,auVar198);
          auVar272._0_4_ = auVar233._0_4_ + auVar210._0_4_;
          auVar272._4_4_ = auVar233._4_4_ + auVar210._4_4_;
          auVar272._8_4_ = auVar233._8_4_ + auVar210._8_4_;
          auVar272._12_4_ = auVar233._12_4_ + auVar210._12_4_;
          auVar210 = vsubps_avx(auVar76,auVar80);
          auVar233 = vmaxps_avx(auVar198,auVar214);
          fVar100 = auVar133._0_4_;
          auVar215._0_4_ = fVar100 * auVar21._0_4_;
          fVar85 = auVar133._4_4_;
          auVar215._4_4_ = fVar85 * auVar21._4_4_;
          fVar144 = auVar133._8_4_;
          auVar215._8_4_ = fVar144 * auVar21._8_4_;
          fVar184 = auVar133._12_4_;
          auVar215._12_4_ = fVar184 * auVar21._12_4_;
          auVar199._0_4_ = auVar81._0_4_ + auVar233._0_4_;
          auVar199._4_4_ = auVar81._4_4_ + auVar233._4_4_;
          auVar199._8_4_ = auVar81._8_4_ + auVar233._8_4_;
          auVar199._12_4_ = auVar81._12_4_ + auVar233._12_4_;
          auVar258._8_8_ = 0x3f800000;
          auVar258._0_8_ = 0x3f800000;
          auVar81 = vsubps_avx(auVar258,auVar199);
          auVar233 = vsubps_avx(auVar258,auVar272);
          auVar273._0_4_ = fVar100 * auVar86._0_4_;
          auVar273._4_4_ = fVar85 * auVar86._4_4_;
          auVar273._8_4_ = fVar144 * auVar86._8_4_;
          auVar273._12_4_ = fVar184 * auVar86._12_4_;
          fVar160 = auVar210._0_4_;
          auVar237._0_4_ = fVar160 * auVar21._0_4_;
          fVar161 = auVar210._4_4_;
          auVar237._4_4_ = fVar161 * auVar21._4_4_;
          fVar253 = auVar210._8_4_;
          auVar237._8_4_ = fVar253 * auVar21._8_4_;
          fVar264 = auVar210._12_4_;
          auVar237._12_4_ = fVar264 * auVar21._12_4_;
          auVar93._0_4_ = fVar160 * auVar86._0_4_;
          auVar93._4_4_ = fVar161 * auVar86._4_4_;
          auVar93._8_4_ = fVar253 * auVar86._8_4_;
          auVar93._12_4_ = fVar264 * auVar86._12_4_;
          auVar291._0_4_ = fVar100 * auVar81._0_4_;
          auVar291._4_4_ = fVar85 * auVar81._4_4_;
          auVar291._8_4_ = fVar144 * auVar81._8_4_;
          auVar291._12_4_ = fVar184 * auVar81._12_4_;
          auVar249._0_4_ = fVar100 * auVar233._0_4_;
          auVar249._4_4_ = fVar85 * auVar233._4_4_;
          auVar249._8_4_ = fVar144 * auVar233._8_4_;
          auVar249._12_4_ = fVar184 * auVar233._12_4_;
          auVar200._0_4_ = fVar160 * auVar81._0_4_;
          auVar200._4_4_ = fVar161 * auVar81._4_4_;
          auVar200._8_4_ = fVar253 * auVar81._8_4_;
          auVar200._12_4_ = fVar264 * auVar81._12_4_;
          auVar259._0_4_ = fVar160 * auVar233._0_4_;
          auVar259._4_4_ = fVar161 * auVar233._4_4_;
          auVar259._8_4_ = fVar253 * auVar233._8_4_;
          auVar259._12_4_ = fVar264 * auVar233._12_4_;
          auVar81 = vminps_avx(auVar291,auVar249);
          auVar233 = vminps_avx(auVar200,auVar259);
          auVar81 = vminps_avx(auVar81,auVar233);
          auVar233 = vmaxps_avx(auVar249,auVar291);
          auVar210 = vminps_avx(auVar215,auVar273);
          auVar20 = vminps_avx(auVar237,auVar93);
          auVar210 = vminps_avx(auVar210,auVar20);
          auVar81 = vhaddps_avx(auVar81,auVar210);
          auVar210 = vmaxps_avx(auVar259,auVar200);
          auVar233 = vmaxps_avx(auVar210,auVar233);
          auVar210 = vmaxps_avx(auVar273,auVar215);
          auVar20 = vmaxps_avx(auVar93,auVar237);
          auVar210 = vmaxps_avx(auVar20,auVar210);
          auVar233 = vhaddps_avx(auVar233,auVar210);
          auVar210 = vshufps_avx(auVar80,auVar80,0x54);
          auVar210 = vsubps_avx(auVar210,_local_608);
          auVar81 = vshufps_avx(auVar81,auVar81,0xe8);
          auVar233 = vshufps_avx(auVar233,auVar233,0xe8);
          auVar216._0_4_ = auVar210._0_4_ + auVar81._0_4_;
          auVar216._4_4_ = auVar210._4_4_ + auVar81._4_4_;
          auVar216._8_4_ = auVar210._8_4_ + auVar81._8_4_;
          auVar216._12_4_ = auVar210._12_4_ + auVar81._12_4_;
          auVar201._0_4_ = auVar210._0_4_ + auVar233._0_4_;
          auVar201._4_4_ = auVar210._4_4_ + auVar233._4_4_;
          auVar201._8_4_ = auVar210._8_4_ + auVar233._8_4_;
          auVar201._12_4_ = auVar210._12_4_ + auVar233._12_4_;
          auVar81 = vmaxps_avx(auVar106,auVar216);
          auVar233 = vminps_avx(auVar201,auVar76);
          auVar81 = vcmpps_avx(auVar233,auVar81,1);
          auVar81 = vshufps_avx(auVar81,auVar81,0x50);
          local_668 = vinsertps_avx(auVar77,ZEXT416((uint)auVar78._0_4_),0x10);
          if ((auVar81 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar81[0xf] < '\0') goto LAB_018b7ccb;
          bVar68 = 0;
          if (auVar216._0_4_ <= auVar181._0_4_) {
            auVar274._8_4_ = 0x7fffffff;
            auVar274._0_8_ = 0x7fffffff7fffffff;
            auVar274._12_4_ = 0x7fffffff;
          }
          else {
            auVar274._8_4_ = 0x7fffffff;
            auVar274._0_8_ = 0x7fffffff7fffffff;
            auVar274._12_4_ = 0x7fffffff;
            bVar68 = 0;
            if (auVar201._0_4_ < auVar76._0_4_) {
              auVar233 = vmovshdup_avx(auVar216);
              auVar81 = vcmpps_avx(auVar201,auVar76,1);
              bVar68 = auVar81[4] & auVar77._0_4_ < auVar233._0_4_;
            }
          }
          if (((3 < (uint)uVar65 || fVar143 < 0.001) | bVar68) == 1) {
            lVar67 = 200;
            do {
              fVar144 = auVar210._0_4_;
              fVar85 = 1.0 - fVar144;
              fVar143 = fVar85 * fVar85 * fVar85;
              fVar100 = fVar144 * 3.0 * fVar85 * fVar85;
              fVar85 = fVar85 * fVar144 * fVar144 * 3.0;
              auVar153._4_4_ = fVar143;
              auVar153._0_4_ = fVar143;
              auVar153._8_4_ = fVar143;
              auVar153._12_4_ = fVar143;
              auVar109._4_4_ = fVar100;
              auVar109._0_4_ = fVar100;
              auVar109._8_4_ = fVar100;
              auVar109._12_4_ = fVar100;
              auVar94._4_4_ = fVar85;
              auVar94._0_4_ = fVar85;
              auVar94._8_4_ = fVar85;
              auVar94._12_4_ = fVar85;
              fVar144 = fVar144 * fVar144 * fVar144;
              auVar176._0_4_ = (float)local_308._0_4_ * fVar144;
              auVar176._4_4_ = (float)local_308._4_4_ * fVar144;
              auVar176._8_4_ = fStack_300 * fVar144;
              auVar176._12_4_ = fStack_2fc * fVar144;
              auVar81 = vfmadd231ps_fma(auVar176,auVar5,auVar94);
              auVar81 = vfmadd231ps_fma(auVar81,auVar4,auVar109);
              auVar81 = vfmadd231ps_fma(auVar81,auVar3,auVar153);
              auVar95._8_8_ = auVar81._0_8_;
              auVar95._0_8_ = auVar81._0_8_;
              auVar81 = vshufpd_avx(auVar81,auVar81,3);
              auVar233 = vshufps_avx(auVar210,auVar210,0x55);
              auVar81 = vsubps_avx(auVar81,auVar95);
              auVar233 = vfmadd213ps_fma(auVar81,auVar233,auVar95);
              fVar143 = auVar233._0_4_;
              auVar81 = vshufps_avx(auVar233,auVar233,0x55);
              auVar96._0_4_ = fVar158 * fVar143 + fVar159 * auVar81._0_4_;
              auVar96._4_4_ = auVar282._4_4_ * fVar143 + auVar6._4_4_ * auVar81._4_4_;
              auVar96._8_4_ = auVar282._8_4_ * fVar143 + auVar6._8_4_ * auVar81._8_4_;
              auVar96._12_4_ = auVar282._12_4_ * fVar143 + auVar6._12_4_ * auVar81._12_4_;
              auVar210 = vsubps_avx(auVar210,auVar96);
              auVar81 = vandps_avx(auVar274,auVar233);
              auVar233 = vshufps_avx(auVar81,auVar81,0xf5);
              auVar81 = vmaxss_avx(auVar233,auVar81);
              if (auVar81._0_4_ < fVar84) {
                local_238 = auVar210._0_4_;
                if ((0.0 <= local_238) && (local_238 <= 1.0)) {
                  auVar81 = vmovshdup_avx(auVar210);
                  fVar143 = auVar81._0_4_;
                  if ((0.0 <= fVar143) && (fVar143 <= 1.0)) {
                    auVar81 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar21 = vinsertps_avx(auVar81,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                  [2]),0x28);
                    auVar81 = vdpps_avx(auVar21,local_4a8,0x7f);
                    auVar282 = vdpps_avx(auVar21,local_4b8,0x7f);
                    auVar6 = vdpps_avx(auVar21,local_318,0x7f);
                    auVar233 = vdpps_avx(auVar21,local_328,0x7f);
                    auVar106 = vdpps_avx(auVar21,local_338,0x7f);
                    auVar76 = vdpps_avx(auVar21,local_348,0x7f);
                    auVar20 = vdpps_avx(auVar21,local_358,0x7f);
                    auVar21 = vdpps_avx(auVar21,local_368,0x7f);
                    fVar158 = 1.0 - fVar143;
                    auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar143 * auVar106._0_4_)),
                                              ZEXT416((uint)fVar158),auVar81);
                    auVar282 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ * fVar143)),
                                               ZEXT416((uint)fVar158),auVar282);
                    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * fVar143)),
                                             ZEXT416((uint)fVar158),auVar6);
                    auVar233 = vfmadd231ss_fma(ZEXT416((uint)(fVar143 * auVar21._0_4_)),
                                               ZEXT416((uint)fVar158),auVar233);
                    fVar100 = 1.0 - local_238;
                    fVar143 = fVar100 * local_238 * local_238 * 3.0;
                    fVar144 = local_238 * local_238 * local_238;
                    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar233._0_4_ * fVar144)),
                                             ZEXT416((uint)fVar143),auVar6);
                    fVar158 = local_238 * 3.0 * fVar100 * fVar100;
                    auVar282 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar158),auVar282);
                    fVar159 = fVar100 * fVar100 * fVar100;
                    auVar81 = vfmadd231ss_fma(auVar282,ZEXT416((uint)fVar159),auVar81);
                    fVar85 = auVar81._0_4_;
                    if ((fVar74 <= fVar85) &&
                       (fVar184 = *(float *)(ray + k * 4 + 0x80), fVar85 <= fVar184)) {
                      pGVar8 = (context->scene->geometries).items[uVar61].ptr;
                      if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        bVar73 = false;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar73 = true, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0))
                      {
                        local_228 = vshufps_avx(auVar210,auVar210,0x55);
                        auVar217._8_4_ = 0x3f800000;
                        auVar217._0_8_ = &DAT_3f8000003f800000;
                        auVar217._12_4_ = 0x3f800000;
                        auVar81 = vsubps_avx(auVar217,local_228);
                        fVar160 = local_228._0_4_;
                        auVar229._0_4_ = fVar160 * (float)local_4d8._0_4_;
                        fVar161 = local_228._4_4_;
                        auVar229._4_4_ = fVar161 * (float)local_4d8._4_4_;
                        fVar253 = local_228._8_4_;
                        auVar229._8_4_ = fVar253 * fStack_4d0;
                        fVar264 = local_228._12_4_;
                        auVar229._12_4_ = fVar264 * fStack_4cc;
                        auVar238._0_4_ = fVar160 * (float)local_518._0_4_;
                        auVar238._4_4_ = fVar161 * (float)local_518._4_4_;
                        auVar238._8_4_ = fVar253 * fStack_510;
                        auVar238._12_4_ = fVar264 * fStack_50c;
                        auVar250._0_4_ = fVar160 * (float)local_528._0_4_;
                        auVar250._4_4_ = fVar161 * (float)local_528._4_4_;
                        auVar250._8_4_ = fVar253 * fStack_520;
                        auVar250._12_4_ = fVar264 * fStack_51c;
                        auVar260._0_4_ = fVar160 * fVar162;
                        auVar260._4_4_ = fVar161 * fVar182;
                        auVar260._8_4_ = fVar253 * fVar185;
                        auVar260._12_4_ = fVar264 * fVar187;
                        auVar282 = vfmadd231ps_fma(auVar229,auVar81,local_4c8);
                        auVar6 = vfmadd231ps_fma(auVar238,auVar81,local_4f8);
                        auVar233 = vfmadd231ps_fma(auVar250,auVar81,local_508);
                        auVar106 = vfmadd231ps_fma(auVar260,auVar81,local_4e8);
                        auVar81 = vsubps_avx(auVar6,auVar282);
                        auVar282 = vsubps_avx(auVar233,auVar6);
                        auVar6 = vsubps_avx(auVar106,auVar233);
                        auVar251._0_4_ = auVar282._0_4_ * local_238;
                        auVar251._4_4_ = auVar282._4_4_ * local_238;
                        auVar251._8_4_ = auVar282._8_4_ * local_238;
                        auVar251._12_4_ = auVar282._12_4_ * local_238;
                        auVar177._4_4_ = fVar100;
                        auVar177._0_4_ = fVar100;
                        auVar177._8_4_ = fVar100;
                        auVar177._12_4_ = fVar100;
                        auVar81 = vfmadd231ps_fma(auVar251,auVar177,auVar81);
                        auVar218._0_4_ = auVar6._0_4_ * local_238;
                        auVar218._4_4_ = auVar6._4_4_ * local_238;
                        auVar218._8_4_ = auVar6._8_4_ * local_238;
                        auVar218._12_4_ = auVar6._12_4_ * local_238;
                        auVar282 = vfmadd231ps_fma(auVar218,auVar177,auVar282);
                        auVar219._0_4_ = auVar282._0_4_ * local_238;
                        auVar219._4_4_ = auVar282._4_4_ * local_238;
                        auVar219._8_4_ = auVar282._8_4_ * local_238;
                        auVar219._12_4_ = auVar282._12_4_ * local_238;
                        auVar282 = vfmadd231ps_fma(auVar219,auVar177,auVar81);
                        auVar154._0_4_ = fVar144 * (float)local_3d8._0_4_;
                        auVar154._4_4_ = fVar144 * (float)local_3d8._4_4_;
                        auVar154._8_4_ = fVar144 * fStack_3d0;
                        auVar154._12_4_ = fVar144 * fStack_3cc;
                        auVar110._4_4_ = fVar143;
                        auVar110._0_4_ = fVar143;
                        auVar110._8_4_ = fVar143;
                        auVar110._12_4_ = fVar143;
                        auVar81 = vfmadd132ps_fma(auVar110,auVar154,local_3c8);
                        auVar139._4_4_ = fVar158;
                        auVar139._0_4_ = fVar158;
                        auVar139._8_4_ = fVar158;
                        auVar139._12_4_ = fVar158;
                        auVar81 = vfmadd132ps_fma(auVar139,auVar81,local_3b8);
                        auVar111._0_4_ = auVar282._0_4_ * 3.0;
                        auVar111._4_4_ = auVar282._4_4_ * 3.0;
                        auVar111._8_4_ = auVar282._8_4_ * 3.0;
                        auVar111._12_4_ = auVar282._12_4_ * 3.0;
                        auVar126._4_4_ = fVar159;
                        auVar126._0_4_ = fVar159;
                        auVar126._8_4_ = fVar159;
                        auVar126._12_4_ = fVar159;
                        auVar282 = vfmadd132ps_fma(auVar126,auVar81,local_3a8);
                        auVar81 = vshufps_avx(auVar111,auVar111,0xc9);
                        auVar140._0_4_ = auVar282._0_4_ * auVar81._0_4_;
                        auVar140._4_4_ = auVar282._4_4_ * auVar81._4_4_;
                        auVar140._8_4_ = auVar282._8_4_ * auVar81._8_4_;
                        auVar140._12_4_ = auVar282._12_4_ * auVar81._12_4_;
                        auVar81 = vshufps_avx(auVar282,auVar282,0xc9);
                        auVar282 = vfmsub231ps_fma(auVar140,auVar111,auVar81);
                        auVar81 = vshufps_avx(auVar282,auVar282,0x55);
                        local_268[0] = (RTCHitN)auVar81[0];
                        local_268[1] = (RTCHitN)auVar81[1];
                        local_268[2] = (RTCHitN)auVar81[2];
                        local_268[3] = (RTCHitN)auVar81[3];
                        local_268[4] = (RTCHitN)auVar81[4];
                        local_268[5] = (RTCHitN)auVar81[5];
                        local_268[6] = (RTCHitN)auVar81[6];
                        local_268[7] = (RTCHitN)auVar81[7];
                        local_268[8] = (RTCHitN)auVar81[8];
                        local_268[9] = (RTCHitN)auVar81[9];
                        local_268[10] = (RTCHitN)auVar81[10];
                        local_268[0xb] = (RTCHitN)auVar81[0xb];
                        local_268[0xc] = (RTCHitN)auVar81[0xc];
                        local_268[0xd] = (RTCHitN)auVar81[0xd];
                        local_268[0xe] = (RTCHitN)auVar81[0xe];
                        local_268[0xf] = (RTCHitN)auVar81[0xf];
                        local_258 = vshufps_avx(auVar282,auVar282,0xaa);
                        local_248 = auVar282._0_4_;
                        uStack_244 = local_248;
                        uStack_240 = local_248;
                        uStack_23c = local_248;
                        fStack_234 = local_238;
                        fStack_230 = local_238;
                        fStack_22c = local_238;
                        local_218 = CONCAT44(uStack_394,local_398);
                        uStack_210 = CONCAT44(uStack_38c,uStack_390);
                        local_208._4_4_ = uStack_384;
                        local_208._0_4_ = local_388;
                        local_208._8_4_ = uStack_380;
                        local_208._12_4_ = uStack_37c;
                        vpcmpeqd_avx2(ZEXT1632(local_208),ZEXT1632(local_208));
                        uStack_1f4 = context->user->instID[0];
                        local_1f8 = uStack_1f4;
                        uStack_1f0 = uStack_1f4;
                        uStack_1ec = uStack_1f4;
                        uStack_1e8 = context->user->instPrimID[0];
                        uStack_1e4 = uStack_1e8;
                        uStack_1e0 = uStack_1e8;
                        uStack_1dc = uStack_1e8;
                        *(float *)(ray + k * 4 + 0x80) = fVar85;
                        local_548 = *local_530;
                        uStack_540 = local_530[1];
                        local_408.valid = (int *)&local_548;
                        local_408.geometryUserPtr = pGVar8->userPtr;
                        local_408.context = context->user;
                        local_408.ray = (RTCRayN *)ray;
                        local_408.hit = local_268;
                        local_408.N = 4;
                        if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar8->occlusionFilterN)(&local_408);
                        }
                        auVar56._8_8_ = uStack_540;
                        auVar56._0_8_ = local_548;
                        if (auVar56 == (undefined1  [16])0x0) {
                          auVar81 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar81 = auVar81 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var9)(&local_408);
                          }
                          auVar57._8_8_ = uStack_540;
                          auVar57._0_8_ = local_548;
                          auVar282 = vpcmpeqd_avx((undefined1  [16])0x0,auVar57);
                          auVar81 = auVar282 ^ _DAT_01febe20;
                          auVar112._8_4_ = 0xff800000;
                          auVar112._0_8_ = 0xff800000ff800000;
                          auVar112._12_4_ = 0xff800000;
                          auVar282 = vblendvps_avx(auVar112,*(undefined1 (*) [16])
                                                             (local_408.ray + 0x80),auVar282);
                          *(undefined1 (*) [16])(local_408.ray + 0x80) = auVar282;
                        }
                        auVar81 = vpslld_avx(auVar81,0x1f);
                        iVar64 = vmovmskps_avx(auVar81);
                        if (iVar64 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar184;
                        }
                        bVar73 = (char)iVar64 != '\0';
                      }
                      bVar71 = (bool)(bVar71 | bVar73);
                    }
                  }
                }
                break;
              }
              lVar67 = lVar67 + -1;
            } while (lVar67 != 0);
          }
          else {
            bVar53 = false;
          }
        }
      }
    } while (bVar53);
    local_378 = vinsertps_avx(auVar12,ZEXT416((uint)fVar157),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }